

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O3

bool embree::avx2::CurveNiIntersectorK<8,8>::
     occluded_t<embree::avx2::RibbonCurve1IntersectorK<embree::BSplineCurveT,8,8>,embree::avx2::Occluded1KEpilogMU<8,8,true>>
               (Precalculations *pre,RayK<8> *ray,size_t k,RayQueryContext *context,Primitive *prim)

{
  undefined1 (*pauVar1) [16];
  undefined1 (*pauVar2) [16];
  undefined1 (*pauVar3) [16];
  undefined1 (*pauVar4) [12];
  undefined1 (*pauVar5) [32];
  undefined1 (*pauVar6) [32];
  float *pfVar7;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar8;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  Primitive PVar16;
  Geometry *pGVar17;
  RTCFilterFunctionN p_Var18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  long lVar24;
  long lVar25;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  float fVar85;
  float fVar86;
  float fVar87;
  float fVar88;
  float fVar89;
  float fVar90;
  undefined8 uVar91;
  undefined8 uVar92;
  undefined8 uVar93;
  undefined8 uVar94;
  undefined8 uVar95;
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [28];
  byte bVar99;
  bool bVar100;
  uint uVar101;
  int iVar102;
  ulong uVar103;
  ulong uVar104;
  ulong uVar105;
  Geometry *geometry;
  long lVar106;
  ulong uVar107;
  undefined4 uVar108;
  undefined8 uVar109;
  undefined1 auVar110 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar111 [16];
  undefined1 auVar124 [32];
  undefined8 uVar125;
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [64];
  float fVar136;
  undefined1 auVar138 [16];
  float fVar137;
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [32];
  undefined1 auVar144 [32];
  undefined1 auVar145 [32];
  undefined1 auVar139 [16];
  undefined1 auVar146 [32];
  undefined1 auVar140 [16];
  undefined1 auVar148 [32];
  undefined1 auVar149 [32];
  undefined1 auVar150 [32];
  undefined1 auVar151 [32];
  undefined1 auVar152 [32];
  undefined1 auVar153 [32];
  undefined1 auVar154 [32];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [32];
  undefined1 auVar163 [32];
  undefined1 auVar164 [32];
  float fVar173;
  float fVar174;
  float fVar175;
  float fVar176;
  float fVar177;
  float fVar178;
  undefined1 auVar165 [32];
  undefined1 auVar166 [32];
  undefined1 auVar167 [32];
  undefined1 auVar168 [32];
  undefined1 auVar169 [32];
  undefined1 auVar170 [32];
  undefined1 auVar171 [32];
  undefined1 auVar172 [32];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [32];
  undefined1 auVar182 [32];
  undefined1 auVar183 [32];
  undefined1 auVar184 [32];
  undefined1 auVar185 [32];
  undefined1 auVar186 [32];
  undefined1 auVar187 [32];
  undefined1 auVar188 [64];
  undefined8 uVar189;
  undefined1 auVar190 [16];
  undefined1 auVar193 [32];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar194 [64];
  undefined1 auVar195 [32];
  undefined1 auVar196 [32];
  undefined1 auVar197 [32];
  undefined1 auVar198 [32];
  undefined1 auVar199 [64];
  undefined1 auVar200 [16];
  undefined1 auVar201 [32];
  undefined1 auVar202 [32];
  undefined1 in_ZMM10 [64];
  undefined1 auVar203 [64];
  undefined4 uVar204;
  undefined1 auVar205 [16];
  undefined1 auVar206 [64];
  float fVar207;
  undefined1 auVar209 [16];
  float fVar208;
  undefined1 auVar210 [32];
  undefined1 auVar211 [32];
  float fVar214;
  undefined1 in_ZMM12 [64];
  undefined1 auVar212 [64];
  undefined1 auVar213 [64];
  float fVar218;
  float fVar219;
  float fVar220;
  float fVar221;
  float fVar222;
  undefined1 auVar215 [32];
  undefined1 auVar216 [32];
  undefined1 auVar217 [32];
  float fVar223;
  float fVar226;
  undefined1 auVar224 [32];
  undefined1 auVar225 [32];
  RTCFilterFunctionNArguments args;
  undefined1 local_960 [32];
  undefined1 local_940 [32];
  undefined1 local_920 [32];
  RTCFilterFunctionNArguments local_770;
  undefined1 local_740 [32];
  undefined1 local_720 [32];
  float local_6f0;
  float fStack_6ec;
  float fStack_6e8;
  float fStack_6e4;
  undefined1 local_6e0 [8];
  float fStack_6d8;
  float fStack_6d4;
  float fStack_6d0;
  float fStack_6cc;
  float fStack_6c8;
  undefined1 local_6c0 [32];
  undefined1 local_6a0 [32];
  undefined1 local_680 [32];
  LinearSpace3fa *local_648;
  undefined8 local_640;
  undefined8 uStack_638;
  undefined8 uStack_630;
  undefined8 uStack_628;
  undefined4 local_620;
  undefined4 uStack_61c;
  undefined4 uStack_618;
  undefined4 uStack_614;
  undefined4 uStack_610;
  undefined4 uStack_60c;
  undefined4 uStack_608;
  undefined4 uStack_604;
  undefined1 local_600 [32];
  undefined1 local_5e0 [8];
  float fStack_5d8;
  float fStack_5d4;
  float fStack_5d0;
  float fStack_5cc;
  float fStack_5c8;
  undefined1 local_5c0 [32];
  undefined1 local_5a0 [32];
  undefined1 local_580 [32];
  ulong local_560;
  undefined4 uStack_558;
  undefined4 uStack_554;
  undefined4 uStack_550;
  undefined4 uStack_54c;
  undefined4 uStack_548;
  undefined4 uStack_544;
  undefined1 local_540 [32];
  undefined1 local_520 [32];
  undefined1 local_500 [32];
  undefined1 local_4e0 [8];
  float fStack_4d8;
  float fStack_4d4;
  float fStack_4d0;
  float fStack_4cc;
  float fStack_4c8;
  float fStack_4c4;
  float local_4c0;
  float fStack_4bc;
  float fStack_4b8;
  float fStack_4b4;
  float fStack_4b0;
  float fStack_4ac;
  float fStack_4a8;
  int iStack_4a4;
  undefined1 local_4a0 [32];
  undefined1 local_480 [32];
  undefined1 local_460 [32];
  undefined4 local_430;
  undefined4 uStack_42c;
  undefined4 uStack_428;
  undefined4 uStack_424;
  undefined1 local_420 [32];
  undefined1 local_400 [32];
  undefined1 local_3e0 [32];
  undefined1 local_3c0 [32];
  undefined1 local_3a0 [32];
  undefined1 local_380 [32];
  int local_360;
  int local_35c;
  undefined8 local_350;
  undefined8 uStack_348;
  undefined8 local_340;
  undefined8 uStack_338;
  undefined8 local_330;
  undefined8 uStack_328;
  float local_2e0 [4];
  float fStack_2d0;
  float fStack_2cc;
  float fStack_2c8;
  float fStack_2c4;
  undefined8 local_2c0;
  undefined8 uStack_2b8;
  undefined8 uStack_2b0;
  undefined8 uStack_2a8;
  undefined1 local_2a0 [32];
  undefined4 local_280;
  undefined4 uStack_27c;
  undefined4 uStack_278;
  undefined4 uStack_274;
  undefined4 uStack_270;
  undefined4 uStack_26c;
  undefined4 uStack_268;
  undefined4 uStack_264;
  undefined8 local_260;
  undefined8 uStack_258;
  undefined8 uStack_250;
  undefined8 uStack_248;
  undefined1 local_240 [32];
  undefined1 local_220 [32];
  undefined4 local_200;
  undefined4 uStack_1fc;
  undefined4 uStack_1f8;
  undefined4 uStack_1f4;
  undefined4 uStack_1f0;
  undefined4 uStack_1ec;
  undefined4 uStack_1e8;
  undefined4 uStack_1e4;
  undefined8 local_1e0;
  undefined8 uStack_1d8;
  undefined8 uStack_1d0;
  undefined8 uStack_1c8;
  undefined1 local_1c0 [32];
  uint local_1a0;
  uint uStack_19c;
  uint uStack_198;
  uint uStack_194;
  uint uStack_190;
  uint uStack_18c;
  uint uStack_188;
  uint uStack_184;
  uint local_180;
  uint uStack_17c;
  uint uStack_178;
  uint uStack_174;
  uint uStack_170;
  uint uStack_16c;
  uint uStack_168;
  uint uStack_164;
  float local_160;
  float fStack_15c;
  float fStack_158;
  float fStack_154;
  float fStack_150;
  float fStack_14c;
  float fStack_148;
  float fStack_144;
  uint local_140;
  uint uStack_13c;
  uint uStack_138;
  uint uStack_134;
  uint uStack_130;
  uint uStack_12c;
  uint uStack_128;
  uint uStack_124;
  undefined4 local_120;
  undefined4 uStack_11c;
  undefined4 uStack_118;
  undefined4 uStack_114;
  undefined4 uStack_110;
  undefined4 uStack_10c;
  undefined4 uStack_108;
  undefined4 uStack_104;
  undefined8 local_100;
  undefined8 uStack_f8;
  undefined8 uStack_f0;
  undefined8 uStack_e8;
  undefined1 local_e0 [32];
  undefined1 local_c0 [32];
  undefined1 local_a0 [32];
  undefined1 local_80 [32];
  undefined1 auVar147 [32];
  
  PVar16 = prim[1];
  uVar107 = (ulong)(byte)PVar16;
  fVar137 = *(float *)(prim + uVar107 * 0x19 + 0x12);
  auVar159 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                           0x10);
  auVar159 = vinsertps_avx(auVar159,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x20);
  auVar19 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x80)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0xa0)),0x10);
  auVar19 = vinsertps_avx(auVar19,ZEXT416(*(uint *)(ray + k * 4 + 0xc0)),0x20);
  auVar159 = vsubps_avx(auVar159,*(undefined1 (*) [16])(prim + uVar107 * 0x19 + 6));
  auVar110._0_4_ = fVar137 * auVar159._0_4_;
  auVar110._4_4_ = fVar137 * auVar159._4_4_;
  auVar110._8_4_ = fVar137 * auVar159._8_4_;
  auVar110._12_4_ = fVar137 * auVar159._12_4_;
  auVar190._0_4_ = fVar137 * auVar19._0_4_;
  auVar190._4_4_ = fVar137 * auVar19._4_4_;
  auVar190._8_4_ = fVar137 * auVar19._8_4_;
  auVar190._12_4_ = fVar137 * auVar19._12_4_;
  auVar159._8_8_ = 0;
  auVar159._0_8_ = *(ulong *)(prim + uVar107 * 4 + 6);
  auVar113 = vpmovsxbd_avx2(auVar159);
  auVar113 = vcvtdq2ps_avx(auVar113);
  auVar19._8_8_ = 0;
  auVar19._0_8_ = *(ulong *)(prim + uVar107 * 5 + 6);
  auVar133 = vpmovsxbd_avx2(auVar19);
  auVar133 = vcvtdq2ps_avx(auVar133);
  auVar10._8_8_ = 0;
  auVar10._0_8_ = *(ulong *)(prim + uVar107 * 6 + 6);
  auVar122 = vpmovsxbd_avx2(auVar10);
  auVar122 = vcvtdq2ps_avx(auVar122);
  auVar11._8_8_ = 0;
  auVar11._0_8_ = *(ulong *)(prim + uVar107 * 0xb + 6);
  auVar172 = vpmovsxbd_avx2(auVar11);
  auVar172 = vcvtdq2ps_avx(auVar172);
  auVar12._8_8_ = 0;
  auVar12._0_8_ = *(ulong *)(prim + (ulong)((uint)(byte)PVar16 * 0xc) + 6);
  auVar149 = vpmovsxbd_avx2(auVar12);
  auVar149 = vcvtdq2ps_avx(auVar149);
  auVar13._8_8_ = 0;
  auVar13._0_8_ = *(ulong *)(prim + (uint)(byte)PVar16 * 0xc + uVar107 + 6);
  auVar21 = vpmovsxbd_avx2(auVar13);
  auVar21 = vcvtdq2ps_avx(auVar21);
  uVar103 = (ulong)(uint)((int)(uVar107 * 9) * 2);
  auVar156._8_8_ = 0;
  auVar156._0_8_ = *(ulong *)(prim + uVar103 + 6);
  auVar22 = vpmovsxbd_avx2(auVar156);
  auVar22 = vcvtdq2ps_avx(auVar22);
  auVar14._8_8_ = 0;
  auVar14._0_8_ = *(ulong *)(prim + uVar103 + uVar107 + 6);
  auVar168 = vpmovsxbd_avx2(auVar14);
  auVar168 = vcvtdq2ps_avx(auVar168);
  auVar206 = ZEXT3264(auVar168);
  uVar103 = (ulong)(uint)((int)(uVar107 * 5) << 2);
  auVar15._8_8_ = 0;
  auVar15._0_8_ = *(ulong *)(prim + uVar103 + 6);
  auVar23 = vpmovsxbd_avx2(auVar15);
  auVar23 = vcvtdq2ps_avx(auVar23);
  auVar183._4_4_ = auVar190._0_4_;
  auVar183._0_4_ = auVar190._0_4_;
  auVar183._8_4_ = auVar190._0_4_;
  auVar183._12_4_ = auVar190._0_4_;
  auVar183._16_4_ = auVar190._0_4_;
  auVar183._20_4_ = auVar190._0_4_;
  auVar183._24_4_ = auVar190._0_4_;
  auVar183._28_4_ = auVar190._0_4_;
  auVar159 = vmovshdup_avx(auVar190);
  uVar189 = auVar159._0_8_;
  auVar224._8_8_ = uVar189;
  auVar224._0_8_ = uVar189;
  auVar224._16_8_ = uVar189;
  auVar224._24_8_ = uVar189;
  auVar159 = vshufps_avx(auVar190,auVar190,0xaa);
  fVar137 = auVar159._0_4_;
  auVar188._0_4_ = fVar137 * auVar122._0_4_;
  fVar136 = auVar159._4_4_;
  auVar188._4_4_ = fVar136 * auVar122._4_4_;
  auVar188._8_4_ = fVar137 * auVar122._8_4_;
  auVar188._12_4_ = fVar136 * auVar122._12_4_;
  auVar188._16_4_ = fVar137 * auVar122._16_4_;
  auVar188._20_4_ = fVar136 * auVar122._20_4_;
  auVar188._28_36_ = in_ZMM12._28_36_;
  auVar188._24_4_ = fVar137 * auVar122._24_4_;
  auVar199._0_4_ = auVar21._0_4_ * fVar137;
  auVar199._4_4_ = auVar21._4_4_ * fVar136;
  auVar199._8_4_ = auVar21._8_4_ * fVar137;
  auVar199._12_4_ = auVar21._12_4_ * fVar136;
  auVar199._16_4_ = auVar21._16_4_ * fVar137;
  auVar199._20_4_ = auVar21._20_4_ * fVar136;
  auVar199._28_36_ = in_ZMM10._28_36_;
  auVar199._24_4_ = auVar21._24_4_ * fVar137;
  auVar196._0_4_ = auVar23._0_4_ * fVar137;
  auVar196._4_4_ = auVar23._4_4_ * fVar136;
  auVar196._8_4_ = auVar23._8_4_ * fVar137;
  auVar196._12_4_ = auVar23._12_4_ * fVar136;
  auVar196._16_4_ = auVar23._16_4_ * fVar137;
  auVar196._20_4_ = auVar23._20_4_ * fVar136;
  auVar196._24_4_ = auVar23._24_4_ * fVar137;
  auVar196._28_4_ = 0;
  auVar159 = vfmadd231ps_fma(auVar188._0_32_,auVar224,auVar133);
  auVar19 = vfmadd231ps_fma(auVar199._0_32_,auVar224,auVar149);
  auVar10 = vfmadd231ps_fma(auVar196,auVar168,auVar224);
  auVar11 = vfmadd231ps_fma(ZEXT1632(auVar159),auVar183,auVar113);
  auVar19 = vfmadd231ps_fma(ZEXT1632(auVar19),auVar183,auVar172);
  auVar10 = vfmadd231ps_fma(ZEXT1632(auVar10),auVar22,auVar183);
  auVar215._4_4_ = auVar110._0_4_;
  auVar215._0_4_ = auVar110._0_4_;
  auVar215._8_4_ = auVar110._0_4_;
  auVar215._12_4_ = auVar110._0_4_;
  auVar215._16_4_ = auVar110._0_4_;
  auVar215._20_4_ = auVar110._0_4_;
  auVar215._24_4_ = auVar110._0_4_;
  auVar215._28_4_ = auVar110._0_4_;
  auVar159 = vmovshdup_avx(auVar110);
  uVar189 = auVar159._0_8_;
  auVar225._8_8_ = uVar189;
  auVar225._0_8_ = uVar189;
  auVar225._16_8_ = uVar189;
  auVar225._24_8_ = uVar189;
  auVar159 = vshufps_avx(auVar110,auVar110,0xaa);
  fVar137 = auVar159._0_4_;
  auVar193._0_4_ = fVar137 * auVar122._0_4_;
  fVar136 = auVar159._4_4_;
  auVar193._4_4_ = fVar136 * auVar122._4_4_;
  auVar193._8_4_ = fVar137 * auVar122._8_4_;
  auVar193._12_4_ = fVar136 * auVar122._12_4_;
  auVar193._16_4_ = fVar137 * auVar122._16_4_;
  auVar193._20_4_ = fVar136 * auVar122._20_4_;
  auVar193._24_4_ = fVar137 * auVar122._24_4_;
  auVar193._28_4_ = 0;
  auVar124._4_4_ = auVar21._4_4_ * fVar136;
  auVar124._0_4_ = auVar21._0_4_ * fVar137;
  auVar124._8_4_ = auVar21._8_4_ * fVar137;
  auVar124._12_4_ = auVar21._12_4_ * fVar136;
  auVar124._16_4_ = auVar21._16_4_ * fVar137;
  auVar124._20_4_ = auVar21._20_4_ * fVar136;
  auVar124._24_4_ = auVar21._24_4_ * fVar137;
  auVar124._28_4_ = auVar122._28_4_;
  auVar122._4_4_ = auVar23._4_4_ * fVar136;
  auVar122._0_4_ = auVar23._0_4_ * fVar137;
  auVar122._8_4_ = auVar23._8_4_ * fVar137;
  auVar122._12_4_ = auVar23._12_4_ * fVar136;
  auVar122._16_4_ = auVar23._16_4_ * fVar137;
  auVar122._20_4_ = auVar23._20_4_ * fVar136;
  auVar122._24_4_ = auVar23._24_4_ * fVar137;
  auVar122._28_4_ = fVar136;
  auVar159 = vfmadd231ps_fma(auVar193,auVar225,auVar133);
  auVar12 = vfmadd231ps_fma(auVar124,auVar225,auVar149);
  auVar13 = vfmadd231ps_fma(auVar122,auVar225,auVar168);
  auVar156 = vfmadd231ps_fma(ZEXT1632(auVar159),auVar215,auVar113);
  auVar12 = vfmadd231ps_fma(ZEXT1632(auVar12),auVar215,auVar172);
  local_400._8_4_ = 0x7fffffff;
  local_400._0_8_ = 0x7fffffff7fffffff;
  local_400._12_4_ = 0x7fffffff;
  local_400._16_4_ = 0x7fffffff;
  local_400._20_4_ = 0x7fffffff;
  local_400._24_4_ = 0x7fffffff;
  local_400._28_4_ = 0x7fffffff;
  auVar115._8_4_ = 0x219392ef;
  auVar115._0_8_ = 0x219392ef219392ef;
  auVar115._12_4_ = 0x219392ef;
  auVar115._16_4_ = 0x219392ef;
  auVar115._20_4_ = 0x219392ef;
  auVar115._24_4_ = 0x219392ef;
  auVar115._28_4_ = 0x219392ef;
  auVar113 = vandps_avx(ZEXT1632(auVar11),local_400);
  auVar113 = vcmpps_avx(auVar113,auVar115,1);
  auVar133 = vblendvps_avx(ZEXT1632(auVar11),auVar115,auVar113);
  auVar113 = vandps_avx(ZEXT1632(auVar19),local_400);
  auVar113 = vcmpps_avx(auVar113,auVar115,1);
  auVar122 = vblendvps_avx(ZEXT1632(auVar19),auVar115,auVar113);
  auVar113 = vandps_avx(ZEXT1632(auVar10),local_400);
  auVar113 = vcmpps_avx(auVar113,auVar115,1);
  auVar113 = vblendvps_avx(ZEXT1632(auVar10),auVar115,auVar113);
  auVar11 = vfmadd231ps_fma(ZEXT1632(auVar13),auVar215,auVar22);
  auVar172 = vrcpps_avx(auVar133);
  auVar165._8_4_ = 0x3f800000;
  auVar165._0_8_ = 0x3f8000003f800000;
  auVar165._12_4_ = 0x3f800000;
  auVar165._16_4_ = 0x3f800000;
  auVar165._20_4_ = 0x3f800000;
  auVar165._24_4_ = 0x3f800000;
  auVar165._28_4_ = 0x3f800000;
  auVar159 = vfnmadd213ps_fma(auVar133,auVar172,auVar165);
  auVar159 = vfmadd132ps_fma(ZEXT1632(auVar159),auVar172,auVar172);
  auVar133 = vrcpps_avx(auVar122);
  auVar19 = vfnmadd213ps_fma(auVar122,auVar133,auVar165);
  auVar19 = vfmadd132ps_fma(ZEXT1632(auVar19),auVar133,auVar133);
  auVar133 = vrcpps_avx(auVar113);
  auVar10 = vfnmadd213ps_fma(auVar113,auVar133,auVar165);
  auVar10 = vfmadd132ps_fma(ZEXT1632(auVar10),auVar133,auVar133);
  auVar113 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar107 * 7 + 6));
  auVar113 = vcvtdq2ps_avx(auVar113);
  auVar113 = vsubps_avx(auVar113,ZEXT1632(auVar156));
  auVar172._4_4_ = auVar159._4_4_ * auVar113._4_4_;
  auVar172._0_4_ = auVar159._0_4_ * auVar113._0_4_;
  auVar172._8_4_ = auVar159._8_4_ * auVar113._8_4_;
  auVar172._12_4_ = auVar159._12_4_ * auVar113._12_4_;
  auVar172._16_4_ = auVar113._16_4_ * 0.0;
  auVar172._20_4_ = auVar113._20_4_ * 0.0;
  auVar172._24_4_ = auVar113._24_4_ * 0.0;
  auVar172._28_4_ = auVar113._28_4_;
  auVar113 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar107 * 9 + 6));
  auVar113 = vcvtdq2ps_avx(auVar113);
  auVar113 = vsubps_avx(auVar113,ZEXT1632(auVar156));
  auVar149._4_4_ = auVar159._4_4_ * auVar113._4_4_;
  auVar149._0_4_ = auVar159._0_4_ * auVar113._0_4_;
  auVar149._8_4_ = auVar159._8_4_ * auVar113._8_4_;
  auVar149._12_4_ = auVar159._12_4_ * auVar113._12_4_;
  auVar149._16_4_ = auVar113._16_4_ * 0.0;
  auVar149._20_4_ = auVar113._20_4_ * 0.0;
  auVar149._24_4_ = auVar113._24_4_ * 0.0;
  auVar149._28_4_ = auVar113._28_4_;
  auVar126._1_3_ = 0;
  auVar126[0] = PVar16;
  auVar133 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + (ulong)(byte)PVar16 * 0x10 + 6));
  auVar113 = vpmovsxwd_avx2(*(undefined1 (*) [16])
                             (prim + (ulong)(byte)PVar16 * 0x10 + uVar107 * -2 + 6));
  auVar113 = vcvtdq2ps_avx(auVar113);
  auVar113 = vsubps_avx(auVar113,ZEXT1632(auVar12));
  auVar21._4_4_ = auVar113._4_4_ * auVar19._4_4_;
  auVar21._0_4_ = auVar113._0_4_ * auVar19._0_4_;
  auVar21._8_4_ = auVar113._8_4_ * auVar19._8_4_;
  auVar21._12_4_ = auVar113._12_4_ * auVar19._12_4_;
  auVar21._16_4_ = auVar113._16_4_ * 0.0;
  auVar21._20_4_ = auVar113._20_4_ * 0.0;
  auVar21._24_4_ = auVar113._24_4_ * 0.0;
  auVar21._28_4_ = auVar113._28_4_;
  auVar113 = vcvtdq2ps_avx(auVar133);
  auVar113 = vsubps_avx(auVar113,ZEXT1632(auVar12));
  auVar22._4_4_ = auVar19._4_4_ * auVar113._4_4_;
  auVar22._0_4_ = auVar19._0_4_ * auVar113._0_4_;
  auVar22._8_4_ = auVar19._8_4_ * auVar113._8_4_;
  auVar22._12_4_ = auVar19._12_4_ * auVar113._12_4_;
  auVar22._16_4_ = auVar113._16_4_ * 0.0;
  auVar22._20_4_ = auVar113._20_4_ * 0.0;
  auVar22._24_4_ = auVar113._24_4_ * 0.0;
  auVar22._28_4_ = auVar113._28_4_;
  auVar113 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar103 + uVar107 + 6));
  auVar113 = vcvtdq2ps_avx(auVar113);
  auVar113 = vsubps_avx(auVar113,ZEXT1632(auVar11));
  auVar168._4_4_ = auVar113._4_4_ * auVar10._4_4_;
  auVar168._0_4_ = auVar113._0_4_ * auVar10._0_4_;
  auVar168._8_4_ = auVar113._8_4_ * auVar10._8_4_;
  auVar168._12_4_ = auVar113._12_4_ * auVar10._12_4_;
  auVar168._16_4_ = auVar113._16_4_ * 0.0;
  auVar168._20_4_ = auVar113._20_4_ * 0.0;
  auVar168._24_4_ = auVar113._24_4_ * 0.0;
  auVar168._28_4_ = auVar113._28_4_;
  auVar113 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar107 * 0x17 + 6));
  auVar113 = vcvtdq2ps_avx(auVar113);
  auVar113 = vsubps_avx(auVar113,ZEXT1632(auVar11));
  auVar23._4_4_ = auVar10._4_4_ * auVar113._4_4_;
  auVar23._0_4_ = auVar10._0_4_ * auVar113._0_4_;
  auVar23._8_4_ = auVar10._8_4_ * auVar113._8_4_;
  auVar23._12_4_ = auVar10._12_4_ * auVar113._12_4_;
  auVar23._16_4_ = auVar113._16_4_ * 0.0;
  auVar23._20_4_ = auVar113._20_4_ * 0.0;
  auVar23._24_4_ = auVar113._24_4_ * 0.0;
  auVar23._28_4_ = auVar113._28_4_;
  auVar113 = vpminsd_avx2(auVar172,auVar149);
  auVar133 = vpminsd_avx2(auVar21,auVar22);
  auVar113 = vmaxps_avx(auVar113,auVar133);
  uVar108 = *(undefined4 *)(ray + k * 4 + 0x60);
  auVar185._4_4_ = uVar108;
  auVar185._0_4_ = uVar108;
  auVar185._8_4_ = uVar108;
  auVar185._12_4_ = uVar108;
  auVar185._16_4_ = uVar108;
  auVar185._20_4_ = uVar108;
  auVar185._24_4_ = uVar108;
  auVar185._28_4_ = uVar108;
  auVar133 = vpminsd_avx2(auVar168,auVar23);
  auVar133 = vmaxps_avx(auVar133,auVar185);
  auVar199 = ZEXT3264(CONCAT428(0x3f7ffffa,
                                CONCAT424(0x3f7ffffa,
                                          CONCAT420(0x3f7ffffa,
                                                    CONCAT416(0x3f7ffffa,
                                                              CONCAT412(0x3f7ffffa,
                                                                        CONCAT48(0x3f7ffffa,
                                                                                 0x3f7ffffa3f7ffffa)
                                                                       ))))));
  auVar113 = vmaxps_avx(auVar113,auVar133);
  local_80._4_4_ = auVar113._4_4_ * 0.99999964;
  local_80._0_4_ = auVar113._0_4_ * 0.99999964;
  local_80._8_4_ = auVar113._8_4_ * 0.99999964;
  local_80._12_4_ = auVar113._12_4_ * 0.99999964;
  local_80._16_4_ = auVar113._16_4_ * 0.99999964;
  local_80._20_4_ = auVar113._20_4_ * 0.99999964;
  local_80._24_4_ = auVar113._24_4_ * 0.99999964;
  local_80._28_4_ = auVar133._28_4_;
  auVar113 = vpmaxsd_avx2(auVar172,auVar149);
  auVar133 = vpmaxsd_avx2(auVar21,auVar22);
  auVar113 = vminps_avx(auVar113,auVar133);
  auVar133 = vpmaxsd_avx2(auVar168,auVar23);
  uVar108 = *(undefined4 *)(ray + k * 4 + 0x100);
  auVar143._4_4_ = uVar108;
  auVar143._0_4_ = uVar108;
  auVar143._8_4_ = uVar108;
  auVar143._12_4_ = uVar108;
  auVar143._16_4_ = uVar108;
  auVar143._20_4_ = uVar108;
  auVar143._24_4_ = uVar108;
  auVar143._28_4_ = uVar108;
  auVar133 = vminps_avx(auVar133,auVar143);
  auVar113 = vminps_avx(auVar113,auVar133);
  auVar20._4_4_ = auVar113._4_4_ * 1.0000004;
  auVar20._0_4_ = auVar113._0_4_ * 1.0000004;
  auVar20._8_4_ = auVar113._8_4_ * 1.0000004;
  auVar20._12_4_ = auVar113._12_4_ * 1.0000004;
  auVar20._16_4_ = auVar113._16_4_ * 1.0000004;
  auVar20._20_4_ = auVar113._20_4_ * 1.0000004;
  auVar20._24_4_ = auVar113._24_4_ * 1.0000004;
  auVar20._28_4_ = auVar113._28_4_;
  auVar126[4] = PVar16;
  auVar126._5_3_ = 0;
  auVar126[8] = PVar16;
  auVar126._9_3_ = 0;
  auVar126[0xc] = PVar16;
  auVar126._13_3_ = 0;
  auVar126[0x10] = PVar16;
  auVar126._17_3_ = 0;
  auVar126[0x14] = PVar16;
  auVar126._21_3_ = 0;
  auVar126[0x18] = PVar16;
  auVar126._25_3_ = 0;
  auVar126[0x1c] = PVar16;
  auVar126._29_3_ = 0;
  auVar133 = vpcmpgtd_avx2(auVar126,_DAT_01fe9900);
  auVar113 = vcmpps_avx(local_80,auVar20,2);
  auVar113 = vandps_avx(auVar113,auVar133);
  uVar101 = vmovmskps_avx(auVar113);
  if (uVar101 == 0) {
    bVar100 = false;
  }
  else {
    uVar101 = uVar101 & 0xff;
    local_648 = pre->ray_space + k;
    local_640 = mm_lookupmask_ps._16_8_;
    uStack_638 = mm_lookupmask_ps._24_8_;
    uStack_630 = mm_lookupmask_ps._16_8_;
    uStack_628 = mm_lookupmask_ps._24_8_;
    iVar102 = 1 << ((uint)k & 0x1f);
    auVar113._4_4_ = iVar102;
    auVar113._0_4_ = iVar102;
    auVar113._8_4_ = iVar102;
    auVar113._12_4_ = iVar102;
    auVar113._16_4_ = iVar102;
    auVar113._20_4_ = iVar102;
    auVar113._24_4_ = iVar102;
    auVar113._28_4_ = iVar102;
    auVar133 = vpmovzxbd_avx2(ZEXT816(0x8040201008040201));
    auVar113 = vpand_avx2(auVar113,auVar133);
    local_420 = vpcmpeqd_avx2(auVar113,auVar133);
    local_430 = 0x7fffffff;
    uStack_42c = 0x7fffffff;
    uStack_428 = 0x7fffffff;
    uStack_424 = 0x7fffffff;
    do {
      auVar113 = local_540;
      local_740 = auVar199._0_32_;
      auVar133 = auVar206._0_32_;
      lVar24 = 0;
      uVar107 = (ulong)uVar101;
      for (uVar103 = uVar107; (uVar103 & 1) == 0; uVar103 = uVar103 >> 1 | 0x8000000000000000) {
        lVar24 = lVar24 + 1;
      }
      local_920._4_4_ = *(undefined4 *)(prim + 2);
      local_6a0._4_4_ = *(undefined4 *)(prim + lVar24 * 4 + 6);
      local_560 = (ulong)(uint)local_6a0._4_4_;
      pGVar17 = (context->scene->geometries).items[(uint)local_920._4_4_].ptr;
      uVar103 = (ulong)*(uint *)(*(long *)&pGVar17->field_0x58 +
                                pGVar17[1].super_RefCount.refCounter.
                                super___atomic_base<unsigned_long>._M_i * local_560);
      p_Var18 = pGVar17[1].intersectionFilterN;
      lVar24 = *(long *)&pGVar17[1].time_range.upper;
      pauVar1 = (undefined1 (*) [16])(lVar24 + (long)p_Var18 * uVar103);
      uVar189 = *(undefined8 *)*pauVar1;
      uVar91 = *(undefined8 *)(*pauVar1 + 8);
      auVar13 = *pauVar1;
      auVar10 = *pauVar1;
      pauVar2 = (undefined1 (*) [16])(lVar24 + (uVar103 + 1) * (long)p_Var18);
      uVar92 = *(undefined8 *)*pauVar2;
      uVar93 = *(undefined8 *)(*pauVar2 + 8);
      auVar12 = *pauVar2;
      auVar19 = *pauVar2;
      pauVar3 = (undefined1 (*) [16])(lVar24 + (uVar103 + 2) * (long)p_Var18);
      uVar94 = *(undefined8 *)*pauVar3;
      uVar95 = *(undefined8 *)(*pauVar3 + 8);
      auVar11 = *pauVar3;
      auVar159 = *pauVar3;
      uVar107 = uVar107 - 1 & uVar107;
      pauVar4 = (undefined1 (*) [12])(lVar24 + (uVar103 + 3) * (long)p_Var18);
      local_6f0 = (float)*(undefined8 *)*pauVar4;
      fStack_6ec = (float)((ulong)*(undefined8 *)*pauVar4 >> 0x20);
      fStack_6e8 = (float)*(undefined8 *)(*pauVar4 + 8);
      fStack_6e4 = (float)((ulong)*(undefined8 *)(*pauVar4 + 8) >> 0x20);
      if (uVar107 != 0) {
        uVar104 = uVar107 - 1 & uVar107;
        for (uVar103 = uVar107; (uVar103 & 1) == 0; uVar103 = uVar103 >> 1 | 0x8000000000000000) {
        }
        if (uVar104 != 0) {
          for (; (uVar104 & 1) == 0; uVar104 = uVar104 >> 1 | 0x8000000000000000) {
          }
        }
      }
      iVar102 = (int)pGVar17[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      auVar156 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),
                               ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x1c);
      auVar110 = vinsertps_avx(auVar156,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x28);
      auVar14 = vsubps_avx(*pauVar1,auVar110);
      uVar108 = auVar14._0_4_;
      auVar155._4_4_ = uVar108;
      auVar155._0_4_ = uVar108;
      auVar155._8_4_ = uVar108;
      auVar155._12_4_ = uVar108;
      auVar156 = vshufps_avx(auVar14,auVar14,0x55);
      auVar14 = vshufps_avx(auVar14,auVar14,0xaa);
      aVar8 = (local_648->vx).field_0;
      aVar9 = (local_648->vy).field_0;
      fVar137 = (local_648->vz).field_0.m128[0];
      fVar136 = *(float *)((long)&(local_648->vz).field_0 + 4);
      fVar173 = *(float *)((long)&(local_648->vz).field_0 + 8);
      fVar174 = *(float *)((long)&(local_648->vz).field_0 + 0xc);
      auVar179._0_4_ = fVar137 * auVar14._0_4_;
      auVar179._4_4_ = fVar136 * auVar14._4_4_;
      auVar179._8_4_ = fVar173 * auVar14._8_4_;
      auVar179._12_4_ = fVar174 * auVar14._12_4_;
      auVar156 = vfmadd231ps_fma(auVar179,(undefined1  [16])aVar9,auVar156);
      auVar155 = vfmadd231ps_fma(auVar156,(undefined1  [16])aVar8,auVar155);
      auVar156 = vblendps_avx(auVar155,*pauVar1,8);
      auVar15 = vsubps_avx(*pauVar2,auVar110);
      uVar108 = auVar15._0_4_;
      auVar180._4_4_ = uVar108;
      auVar180._0_4_ = uVar108;
      auVar180._8_4_ = uVar108;
      auVar180._12_4_ = uVar108;
      auVar14 = vshufps_avx(auVar15,auVar15,0x55);
      auVar15 = vshufps_avx(auVar15,auVar15,0xaa);
      auVar200._0_4_ = fVar137 * auVar15._0_4_;
      auVar200._4_4_ = fVar136 * auVar15._4_4_;
      auVar200._8_4_ = fVar173 * auVar15._8_4_;
      auVar200._12_4_ = fVar174 * auVar15._12_4_;
      auVar14 = vfmadd231ps_fma(auVar200,(undefined1  [16])aVar9,auVar14);
      auVar179 = vfmadd231ps_fma(auVar14,(undefined1  [16])aVar8,auVar180);
      auVar14 = vblendps_avx(auVar179,*pauVar2,8);
      auVar190 = vsubps_avx(*pauVar3,auVar110);
      uVar108 = auVar190._0_4_;
      auVar191._4_4_ = uVar108;
      auVar191._0_4_ = uVar108;
      auVar191._8_4_ = uVar108;
      auVar191._12_4_ = uVar108;
      auVar15 = vshufps_avx(auVar190,auVar190,0x55);
      auVar190 = vshufps_avx(auVar190,auVar190,0xaa);
      auVar205._0_4_ = fVar137 * auVar190._0_4_;
      auVar205._4_4_ = fVar136 * auVar190._4_4_;
      auVar205._8_4_ = fVar173 * auVar190._8_4_;
      auVar205._12_4_ = fVar174 * auVar190._12_4_;
      auVar15 = vfmadd231ps_fma(auVar205,(undefined1  [16])aVar9,auVar15);
      auVar180 = vfmadd231ps_fma(auVar15,(undefined1  [16])aVar8,auVar191);
      auVar15 = vblendps_avx(auVar180,*pauVar3,8);
      auVar26._12_4_ = fStack_6e4;
      auVar26._0_12_ = *pauVar4;
      auVar190 = vsubps_avx(auVar26,auVar110);
      uVar108 = auVar190._0_4_;
      auVar192._4_4_ = uVar108;
      auVar192._0_4_ = uVar108;
      auVar192._8_4_ = uVar108;
      auVar192._12_4_ = uVar108;
      auVar110 = vshufps_avx(auVar190,auVar190,0x55);
      auVar190 = vshufps_avx(auVar190,auVar190,0xaa);
      auVar209._0_4_ = fVar137 * auVar190._0_4_;
      auVar209._4_4_ = fVar136 * auVar190._4_4_;
      auVar209._8_4_ = fVar173 * auVar190._8_4_;
      auVar209._12_4_ = fVar174 * auVar190._12_4_;
      auVar110 = vfmadd231ps_fma(auVar209,(undefined1  [16])aVar9,auVar110);
      auVar191 = vfmadd231ps_fma(auVar110,(undefined1  [16])aVar8,auVar192);
      auVar110 = vblendps_avx(auVar191,auVar26,8);
      auVar28._4_4_ = uStack_42c;
      auVar28._0_4_ = local_430;
      auVar28._8_4_ = uStack_428;
      auVar28._12_4_ = uStack_424;
      auVar156 = vandps_avx(auVar156,auVar28);
      auVar14 = vandps_avx(auVar14,auVar28);
      auVar190 = vmaxps_avx(auVar156,auVar14);
      auVar156 = vandps_avx(auVar15,auVar28);
      auVar14 = vandps_avx(auVar110,auVar28);
      auVar156 = vmaxps_avx(auVar156,auVar14);
      auVar156 = vmaxps_avx(auVar190,auVar156);
      auVar14 = vmovshdup_avx(auVar156);
      auVar14 = vmaxss_avx(auVar14,auVar156);
      auVar156 = vshufpd_avx(auVar156,auVar156,1);
      auVar156 = vmaxss_avx(auVar156,auVar14);
      lVar24 = (long)iVar102 * 0x44;
      auVar14 = vmovshdup_avx(auVar155);
      uVar109 = auVar14._0_8_;
      local_600._8_8_ = uVar109;
      local_600._0_8_ = uVar109;
      local_600._16_8_ = uVar109;
      local_600._24_8_ = uVar109;
      auVar122 = *(undefined1 (*) [32])(bspline_basis0 + lVar24 + 0x484);
      auVar14 = vmovshdup_avx(auVar179);
      uVar109 = auVar14._0_8_;
      auVar152._8_8_ = uVar109;
      auVar152._0_8_ = uVar109;
      auVar152._16_8_ = uVar109;
      auVar152._24_8_ = uVar109;
      auVar172 = *(undefined1 (*) [32])(bspline_basis0 + lVar24 + 0x908);
      uVar204 = auVar180._0_4_;
      auVar144._4_4_ = uVar204;
      auVar144._0_4_ = uVar204;
      auVar144._8_4_ = uVar204;
      auVar144._12_4_ = uVar204;
      auVar144._16_4_ = uVar204;
      auVar144._20_4_ = uVar204;
      auVar144._24_4_ = uVar204;
      auVar144._28_4_ = uVar204;
      auVar14 = vmovshdup_avx(auVar180);
      uVar109 = auVar14._0_8_;
      auVar166._8_8_ = uVar109;
      auVar166._0_8_ = uVar109;
      auVar166._16_8_ = uVar109;
      auVar166._24_8_ = uVar109;
      fVar136 = *(float *)*(undefined1 (*) [28])(bspline_basis0 + lVar24 + 0xd8c);
      fVar173 = *(float *)(bspline_basis0 + lVar24 + 0xd90);
      fVar174 = *(float *)(bspline_basis0 + lVar24 + 0xd94);
      fVar175 = *(float *)(bspline_basis0 + lVar24 + 0xd98);
      fVar176 = *(float *)(bspline_basis0 + lVar24 + 0xd9c);
      fVar177 = *(float *)(bspline_basis0 + lVar24 + 0xda0);
      fVar178 = *(float *)(bspline_basis0 + lVar24 + 0xda4);
      auVar98 = *(undefined1 (*) [28])(bspline_basis0 + lVar24 + 0xd8c);
      fVar207 = auVar191._0_4_;
      auVar14 = vmovshdup_avx(auVar191);
      uVar109 = auVar14._0_8_;
      auVar181._0_4_ = fVar136 * fVar207;
      auVar181._4_4_ = fVar173 * fVar207;
      auVar181._8_4_ = fVar174 * fVar207;
      auVar181._12_4_ = fVar175 * fVar207;
      auVar181._16_4_ = fVar176 * fVar207;
      auVar181._20_4_ = fVar177 * fVar207;
      auVar181._24_4_ = fVar178 * fVar207;
      auVar181._28_4_ = 0;
      fVar223 = auVar14._0_4_;
      auVar114._0_4_ = fVar223 * fVar136;
      fVar226 = auVar14._4_4_;
      auVar114._4_4_ = fVar226 * fVar173;
      auVar114._8_4_ = fVar223 * fVar174;
      auVar114._12_4_ = fVar226 * fVar175;
      auVar114._16_4_ = fVar223 * fVar176;
      auVar114._20_4_ = fVar226 * fVar177;
      auVar114._24_4_ = fVar223 * fVar178;
      auVar114._28_4_ = 0;
      auVar14 = vfmadd231ps_fma(auVar181,auVar172,auVar144);
      auVar15 = vfmadd231ps_fma(auVar114,auVar172,auVar166);
      uVar108 = auVar179._0_4_;
      auVar216._4_4_ = uVar108;
      auVar216._0_4_ = uVar108;
      auVar216._8_4_ = uVar108;
      auVar216._12_4_ = uVar108;
      auVar216._16_4_ = uVar108;
      auVar216._20_4_ = uVar108;
      auVar216._24_4_ = uVar108;
      auVar216._28_4_ = uVar108;
      auVar14 = vfmadd231ps_fma(ZEXT1632(auVar14),auVar122,auVar216);
      auVar15 = vfmadd231ps_fma(ZEXT1632(auVar15),auVar122,auVar152);
      auVar149 = *(undefined1 (*) [32])(bspline_basis0 + lVar24);
      uVar108 = auVar155._0_4_;
      auVar162._4_4_ = uVar108;
      auVar162._0_4_ = uVar108;
      auVar162._8_4_ = uVar108;
      auVar162._12_4_ = uVar108;
      auVar162._16_4_ = uVar108;
      auVar162._20_4_ = uVar108;
      auVar162._24_4_ = uVar108;
      auVar162._28_4_ = uVar108;
      auVar14 = vfmadd231ps_fma(ZEXT1632(auVar14),auVar149,auVar162);
      auVar15 = vfmadd231ps_fma(ZEXT1632(auVar15),auVar149,local_600);
      auVar21 = *(undefined1 (*) [32])(bspline_basis1 + lVar24 + 0x908);
      local_4c0 = *(float *)(bspline_basis1 + lVar24 + 0xd8c);
      fStack_4bc = *(float *)(bspline_basis1 + lVar24 + 0xd90);
      fStack_4b8 = *(float *)(bspline_basis1 + lVar24 + 0xd94);
      fStack_4b4 = *(float *)(bspline_basis1 + lVar24 + 0xd98);
      fStack_4b0 = *(float *)(bspline_basis1 + lVar24 + 0xd9c);
      fStack_4ac = *(float *)(bspline_basis1 + lVar24 + 0xda0);
      fStack_4a8 = *(float *)(bspline_basis1 + lVar24 + 0xda4);
      iStack_4a4 = *(int *)(bspline_basis1 + lVar24 + 0xda8);
      auVar29._4_4_ = fStack_4bc * fVar207;
      auVar29._0_4_ = local_4c0 * fVar207;
      auVar29._8_4_ = fStack_4b8 * fVar207;
      auVar29._12_4_ = fStack_4b4 * fVar207;
      auVar29._16_4_ = fStack_4b0 * fVar207;
      auVar29._20_4_ = fStack_4ac * fVar207;
      auVar29._24_4_ = fStack_4a8 * fVar207;
      auVar29._28_4_ = fVar207;
      auVar110 = vfmadd231ps_fma(auVar29,auVar21,auVar144);
      auVar30._4_4_ = fVar226 * fStack_4bc;
      auVar30._0_4_ = fVar223 * local_4c0;
      auVar30._8_4_ = fVar223 * fStack_4b8;
      auVar30._12_4_ = fVar226 * fStack_4b4;
      auVar30._16_4_ = fVar223 * fStack_4b0;
      auVar30._20_4_ = fVar226 * fStack_4ac;
      auVar30._24_4_ = fVar223 * fStack_4a8;
      auVar30._28_4_ = uVar204;
      auVar190 = vfmadd231ps_fma(auVar30,auVar21,auVar166);
      auVar22 = *(undefined1 (*) [32])(bspline_basis1 + lVar24 + 0x484);
      auVar110 = vfmadd231ps_fma(ZEXT1632(auVar110),auVar22,auVar216);
      auVar190 = vfmadd231ps_fma(ZEXT1632(auVar190),auVar22,auVar152);
      auVar168 = *(undefined1 (*) [32])(bspline_basis1 + lVar24);
      auVar110 = vfmadd231ps_fma(ZEXT1632(auVar110),auVar168,auVar162);
      auVar190 = vfmadd231ps_fma(ZEXT1632(auVar190),auVar168,local_600);
      local_460 = ZEXT1632(auVar110);
      local_4a0 = ZEXT1632(auVar14);
      auVar124 = vsubps_avx(local_460,local_4a0);
      local_480 = ZEXT1632(auVar190);
      auVar115 = ZEXT1632(auVar15);
      auVar20 = vsubps_avx(local_480,auVar115);
      auVar116._0_4_ = auVar15._0_4_ * auVar124._0_4_;
      auVar116._4_4_ = auVar15._4_4_ * auVar124._4_4_;
      auVar116._8_4_ = auVar15._8_4_ * auVar124._8_4_;
      auVar116._12_4_ = auVar15._12_4_ * auVar124._12_4_;
      auVar116._16_4_ = auVar124._16_4_ * 0.0;
      auVar116._20_4_ = auVar124._20_4_ * 0.0;
      auVar116._24_4_ = auVar124._24_4_ * 0.0;
      auVar116._28_4_ = 0;
      fVar208 = auVar20._0_4_;
      auVar127._0_4_ = fVar208 * auVar14._0_4_;
      fVar214 = auVar20._4_4_;
      auVar127._4_4_ = fVar214 * auVar14._4_4_;
      fVar218 = auVar20._8_4_;
      auVar127._8_4_ = fVar218 * auVar14._8_4_;
      fVar219 = auVar20._12_4_;
      auVar127._12_4_ = fVar219 * auVar14._12_4_;
      fVar220 = auVar20._16_4_;
      auVar127._16_4_ = fVar220 * 0.0;
      fVar221 = auVar20._20_4_;
      auVar127._20_4_ = fVar221 * 0.0;
      fVar222 = auVar20._24_4_;
      auVar127._24_4_ = fVar222 * 0.0;
      auVar127._28_4_ = 0;
      auVar126 = vsubps_avx(auVar116,auVar127);
      auVar14 = vpermilps_avx(*pauVar1,0xff);
      uVar125 = auVar14._0_8_;
      local_a0._8_8_ = uVar125;
      local_a0._0_8_ = uVar125;
      local_a0._16_8_ = uVar125;
      local_a0._24_8_ = uVar125;
      auVar15 = vpermilps_avx(*pauVar2,0xff);
      uVar125 = auVar15._0_8_;
      local_c0._8_8_ = uVar125;
      local_c0._0_8_ = uVar125;
      local_c0._16_8_ = uVar125;
      local_c0._24_8_ = uVar125;
      auVar15 = vpermilps_avx(*pauVar3,0xff);
      uVar125 = auVar15._0_8_;
      local_e0._8_8_ = uVar125;
      local_e0._0_8_ = uVar125;
      local_e0._16_8_ = uVar125;
      local_e0._24_8_ = uVar125;
      auVar27._12_4_ = fStack_6e4;
      auVar27._0_12_ = *pauVar4;
      auVar15 = vpermilps_avx(auVar27,0xff);
      local_100 = auVar15._0_8_;
      fVar137 = auVar15._0_4_;
      auVar182._0_4_ = fVar136 * fVar137;
      fVar136 = auVar15._4_4_;
      auVar182._4_4_ = fVar173 * fVar136;
      auVar182._8_4_ = fVar174 * fVar137;
      auVar182._12_4_ = fVar175 * fVar136;
      auVar182._16_4_ = fVar176 * fVar137;
      auVar182._20_4_ = fVar177 * fVar136;
      auVar182._24_4_ = fVar178 * fVar137;
      auVar182._28_4_ = 0;
      auVar15 = vfmadd231ps_fma(auVar182,local_e0,auVar172);
      auVar15 = vfmadd231ps_fma(ZEXT1632(auVar15),local_c0,auVar122);
      auVar110 = vfmadd231ps_fma(ZEXT1632(auVar15),auVar149,local_a0);
      uStack_f8 = local_100;
      uStack_f0 = local_100;
      uStack_e8 = local_100;
      auVar31._4_4_ = fStack_4bc * fVar136;
      auVar31._0_4_ = local_4c0 * fVar137;
      auVar31._8_4_ = fStack_4b8 * fVar137;
      auVar31._12_4_ = fStack_4b4 * fVar136;
      auVar31._16_4_ = fStack_4b0 * fVar137;
      auVar31._20_4_ = fStack_4ac * fVar136;
      auVar31._24_4_ = fStack_4a8 * fVar137;
      auVar31._28_4_ = auVar149._28_4_;
      auVar15 = vfmadd231ps_fma(auVar31,auVar21,local_e0);
      auVar15 = vfmadd231ps_fma(ZEXT1632(auVar15),auVar22,local_c0);
      auVar190 = vfmadd231ps_fma(ZEXT1632(auVar15),auVar168,local_a0);
      auVar32._4_4_ = fVar214 * fVar214;
      auVar32._0_4_ = fVar208 * fVar208;
      auVar32._8_4_ = fVar218 * fVar218;
      auVar32._12_4_ = fVar219 * fVar219;
      auVar32._16_4_ = fVar220 * fVar220;
      auVar32._20_4_ = fVar221 * fVar221;
      auVar32._24_4_ = fVar222 * fVar222;
      auVar32._28_4_ = auVar14._4_4_;
      auVar14 = vfmadd231ps_fma(auVar32,auVar124,auVar124);
      auVar23 = vmaxps_avx(ZEXT1632(auVar110),ZEXT1632(auVar190));
      auVar33._4_4_ = auVar23._4_4_ * auVar23._4_4_ * auVar14._4_4_;
      auVar33._0_4_ = auVar23._0_4_ * auVar23._0_4_ * auVar14._0_4_;
      auVar33._8_4_ = auVar23._8_4_ * auVar23._8_4_ * auVar14._8_4_;
      auVar33._12_4_ = auVar23._12_4_ * auVar23._12_4_ * auVar14._12_4_;
      auVar33._16_4_ = auVar23._16_4_ * auVar23._16_4_ * 0.0;
      auVar33._20_4_ = auVar23._20_4_ * auVar23._20_4_ * 0.0;
      auVar33._24_4_ = auVar23._24_4_ * auVar23._24_4_ * 0.0;
      auVar33._28_4_ = auVar23._28_4_;
      auVar34._4_4_ = auVar126._4_4_ * auVar126._4_4_;
      auVar34._0_4_ = auVar126._0_4_ * auVar126._0_4_;
      auVar34._8_4_ = auVar126._8_4_ * auVar126._8_4_;
      auVar34._12_4_ = auVar126._12_4_ * auVar126._12_4_;
      auVar34._16_4_ = auVar126._16_4_ * auVar126._16_4_;
      auVar34._20_4_ = auVar126._20_4_ * auVar126._20_4_;
      auVar34._24_4_ = auVar126._24_4_ * auVar126._24_4_;
      auVar34._28_4_ = auVar126._28_4_;
      auVar23 = vcmpps_avx(auVar34,auVar33,2);
      fVar137 = auVar156._0_4_ * 4.7683716e-07;
      auVar117._0_4_ = (float)iVar102;
      local_540._4_12_ = auVar180._4_12_;
      local_540._0_4_ = auVar117._0_4_;
      local_540._16_16_ = auVar113._16_16_;
      auVar117._4_4_ = auVar117._0_4_;
      auVar117._8_4_ = auVar117._0_4_;
      auVar117._12_4_ = auVar117._0_4_;
      auVar117._16_4_ = auVar117._0_4_;
      auVar117._20_4_ = auVar117._0_4_;
      auVar117._24_4_ = auVar117._0_4_;
      auVar117._28_4_ = auVar117._0_4_;
      auVar113 = vcmpps_avx(_DAT_01faff40,auVar117,1);
      auVar14 = vpermilps_avx(auVar155,0xaa);
      uVar125 = auVar14._0_8_;
      local_5c0._8_8_ = uVar125;
      local_5c0._0_8_ = uVar125;
      local_5c0._16_8_ = uVar125;
      local_5c0._24_8_ = uVar125;
      auVar15 = vpermilps_avx(auVar179,0xaa);
      uVar125 = auVar15._0_8_;
      local_5a0._8_8_ = uVar125;
      local_5a0._0_8_ = uVar125;
      local_5a0._16_8_ = uVar125;
      local_5a0._24_8_ = uVar125;
      auVar156 = vshufps_avx(auVar180,auVar180,0xaa);
      uVar125 = auVar156._0_8_;
      local_3e0._8_8_ = uVar125;
      local_3e0._0_8_ = uVar125;
      local_3e0._16_8_ = uVar125;
      local_3e0._24_8_ = uVar125;
      auVar156 = vshufps_avx(auVar191,auVar191,0xaa);
      uVar125 = auVar156._0_8_;
      register0x00001508 = uVar125;
      local_6e0 = uVar125;
      register0x00001510 = uVar125;
      register0x00001518 = uVar125;
      auVar126 = auVar113 & auVar23;
      local_620 = *(undefined4 *)(ray + k * 4 + 0x60);
      uStack_61c = 0;
      uStack_618 = 0;
      uStack_614 = 0;
      if ((((((((auVar126 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar126 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar126 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar126 >> 0x7f,0) == '\0') &&
            (auVar126 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar126 >> 0xbf,0) == '\0') &&
          (auVar126 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
          -1 < auVar126[0x1f]) {
        auVar206 = ZEXT3264(auVar133);
LAB_0183f142:
        auVar194 = ZEXT3264(CONCAT428(fVar207,CONCAT424(fVar207,CONCAT420(fVar207,CONCAT416(fVar207,
                                                  CONCAT412(fVar207,CONCAT48(fVar207,CONCAT44(
                                                  fVar207,fVar207))))))));
        auVar188 = ZEXT3264(CONCAT428(fVar226,CONCAT424(fVar223,CONCAT420(fVar226,CONCAT416(fVar223,
                                                  CONCAT412(fVar226,CONCAT48(fVar223,uVar109)))))));
LAB_0183f15d:
        auVar213 = ZEXT3264(_local_6e0);
        bVar100 = false;
      }
      else {
        _local_4e0 = vandps_avx(auVar23,auVar113);
        fVar208 = auVar156._0_4_;
        fVar214 = auVar156._4_4_;
        auVar35._4_4_ = fVar214 * fStack_4bc;
        auVar35._0_4_ = fVar208 * local_4c0;
        auVar35._8_4_ = fVar208 * fStack_4b8;
        auVar35._12_4_ = fVar214 * fStack_4b4;
        auVar35._16_4_ = fVar208 * fStack_4b0;
        auVar35._20_4_ = fVar214 * fStack_4ac;
        auVar35._24_4_ = fVar208 * fStack_4a8;
        auVar35._28_4_ = local_4e0._28_4_;
        auVar156 = vfmadd213ps_fma(auVar21,local_3e0,auVar35);
        auVar156 = vfmadd213ps_fma(auVar22,local_5a0,ZEXT1632(auVar156));
        auVar156 = vfmadd213ps_fma(auVar168,local_5c0,ZEXT1632(auVar156));
        local_5e0._0_4_ = auVar98._0_4_;
        local_5e0._4_4_ = auVar98._4_4_;
        fStack_5d8 = auVar98._8_4_;
        fStack_5d4 = auVar98._12_4_;
        fStack_5d0 = auVar98._16_4_;
        fStack_5cc = auVar98._20_4_;
        fStack_5c8 = auVar98._24_4_;
        auVar118._0_4_ = fVar208 * (float)local_5e0._0_4_;
        auVar118._4_4_ = fVar214 * (float)local_5e0._4_4_;
        auVar118._8_4_ = fVar208 * fStack_5d8;
        auVar118._12_4_ = fVar214 * fStack_5d4;
        auVar118._16_4_ = fVar208 * fStack_5d0;
        auVar118._20_4_ = fVar214 * fStack_5cc;
        auVar118._24_4_ = fVar208 * fStack_5c8;
        auVar118._28_4_ = 0;
        auVar155 = vfmadd213ps_fma(auVar172,local_3e0,auVar118);
        auVar155 = vfmadd213ps_fma(auVar122,local_5a0,ZEXT1632(auVar155));
        auVar113 = *(undefined1 (*) [32])(bspline_basis0 + lVar24 + 0x1210);
        auVar122 = *(undefined1 (*) [32])(bspline_basis0 + lVar24 + 0x1694);
        auVar172 = *(undefined1 (*) [32])(bspline_basis0 + lVar24 + 0x1b18);
        fVar136 = *(float *)(bspline_basis0 + lVar24 + 0x1f9c);
        fVar173 = *(float *)(bspline_basis0 + lVar24 + 0x1fa0);
        fVar174 = *(float *)(bspline_basis0 + lVar24 + 0x1fa4);
        fVar175 = *(float *)(bspline_basis0 + lVar24 + 0x1fa8);
        fVar176 = *(float *)(bspline_basis0 + lVar24 + 0x1fac);
        fVar177 = *(float *)(bspline_basis0 + lVar24 + 0x1fb0);
        fVar178 = *(float *)(bspline_basis0 + lVar24 + 0x1fb4);
        auVar167._0_4_ = fVar136 * fVar207;
        auVar167._4_4_ = fVar173 * fVar207;
        auVar167._8_4_ = fVar174 * fVar207;
        auVar167._12_4_ = fVar175 * fVar207;
        auVar167._16_4_ = fVar176 * fVar207;
        auVar167._20_4_ = fVar177 * fVar207;
        auVar167._24_4_ = fVar178 * fVar207;
        auVar167._28_4_ = 0;
        auVar36._4_4_ = fVar226 * fVar173;
        auVar36._0_4_ = fVar223 * fVar136;
        auVar36._8_4_ = fVar223 * fVar174;
        auVar36._12_4_ = fVar226 * fVar175;
        auVar36._16_4_ = fVar223 * fVar176;
        auVar36._20_4_ = fVar226 * fVar177;
        auVar36._24_4_ = fVar223 * fVar178;
        auVar36._28_4_ = auVar15._4_4_;
        auVar201._0_4_ = fVar208 * fVar136;
        auVar201._4_4_ = fVar214 * fVar173;
        auVar201._8_4_ = fVar208 * fVar174;
        auVar201._12_4_ = fVar214 * fVar175;
        auVar201._16_4_ = fVar208 * fVar176;
        auVar201._20_4_ = fVar214 * fVar177;
        auVar201._24_4_ = fVar208 * fVar178;
        auVar201._28_4_ = 0;
        auVar15 = vfmadd231ps_fma(auVar167,auVar172,auVar144);
        auVar179 = vfmadd231ps_fma(auVar36,auVar172,auVar166);
        auVar180 = vfmadd231ps_fma(auVar201,local_3e0,auVar172);
        auVar15 = vfmadd231ps_fma(ZEXT1632(auVar15),auVar122,auVar216);
        auVar179 = vfmadd231ps_fma(ZEXT1632(auVar179),auVar122,auVar152);
        auVar180 = vfmadd231ps_fma(ZEXT1632(auVar180),auVar122,local_5a0);
        auVar15 = vfmadd231ps_fma(ZEXT1632(auVar15),auVar113,auVar162);
        auVar179 = vfmadd231ps_fma(ZEXT1632(auVar179),auVar113,local_600);
        auVar180 = vfmadd231ps_fma(ZEXT1632(auVar180),local_5c0,auVar113);
        fVar136 = *(float *)(bspline_basis1 + lVar24 + 0x1f9c);
        fVar173 = *(float *)(bspline_basis1 + lVar24 + 0x1fa0);
        fVar174 = *(float *)(bspline_basis1 + lVar24 + 0x1fa4);
        fVar175 = *(float *)(bspline_basis1 + lVar24 + 0x1fa8);
        fVar176 = *(float *)(bspline_basis1 + lVar24 + 0x1fac);
        fVar177 = *(float *)(bspline_basis1 + lVar24 + 0x1fb0);
        fVar178 = *(float *)(bspline_basis1 + lVar24 + 0x1fb4);
        auVar37._4_4_ = fVar173 * fVar207;
        auVar37._0_4_ = fVar136 * fVar207;
        auVar37._8_4_ = fVar174 * fVar207;
        auVar37._12_4_ = fVar175 * fVar207;
        auVar37._16_4_ = fVar176 * fVar207;
        auVar37._20_4_ = fVar177 * fVar207;
        auVar37._24_4_ = fVar178 * fVar207;
        auVar37._28_4_ = auVar113._28_4_;
        auVar38._4_4_ = fVar226 * fVar173;
        auVar38._0_4_ = fVar223 * fVar136;
        auVar38._8_4_ = fVar223 * fVar174;
        auVar38._12_4_ = fVar226 * fVar175;
        auVar38._16_4_ = fVar223 * fVar176;
        auVar38._20_4_ = fVar226 * fVar177;
        auVar38._24_4_ = fVar223 * fVar178;
        auVar38._28_4_ = fVar214;
        auVar39._4_4_ = fVar214 * fVar173;
        auVar39._0_4_ = fVar208 * fVar136;
        auVar39._8_4_ = fVar208 * fVar174;
        auVar39._12_4_ = fVar214 * fVar175;
        auVar39._16_4_ = fVar208 * fVar176;
        auVar39._20_4_ = fVar214 * fVar177;
        auVar39._24_4_ = fVar208 * fVar178;
        auVar39._28_4_ = auVar14._4_4_;
        auVar113 = *(undefined1 (*) [32])(bspline_basis1 + lVar24 + 0x1b18);
        auVar14 = vfmadd231ps_fma(auVar37,auVar113,auVar144);
        auVar191 = vfmadd231ps_fma(auVar38,auVar113,auVar166);
        auVar26 = vfmadd231ps_fma(auVar39,auVar113,local_3e0);
        auVar113 = *(undefined1 (*) [32])(bspline_basis1 + lVar24 + 0x1694);
        auVar14 = vfmadd231ps_fma(ZEXT1632(auVar14),auVar113,auVar216);
        auVar191 = vfmadd231ps_fma(ZEXT1632(auVar191),auVar113,auVar152);
        auVar26 = vfmadd231ps_fma(ZEXT1632(auVar26),auVar113,local_5a0);
        auVar113 = *(undefined1 (*) [32])(bspline_basis1 + lVar24 + 0x1210);
        auVar14 = vfmadd231ps_fma(ZEXT1632(auVar14),auVar113,auVar162);
        auVar191 = vfmadd231ps_fma(ZEXT1632(auVar191),auVar113,local_600);
        auVar26 = vfmadd231ps_fma(ZEXT1632(auVar26),local_5c0,auVar113);
        auVar113 = vandps_avx(local_400,ZEXT1632(auVar15));
        auVar122 = vandps_avx(ZEXT1632(auVar179),local_400);
        auVar122 = vmaxps_avx(auVar113,auVar122);
        auVar113 = vandps_avx(ZEXT1632(auVar180),local_400);
        auVar113 = vmaxps_avx(auVar122,auVar113);
        auVar128._4_4_ = fVar137;
        auVar128._0_4_ = fVar137;
        auVar128._8_4_ = fVar137;
        auVar128._12_4_ = fVar137;
        auVar128._16_4_ = fVar137;
        auVar128._20_4_ = fVar137;
        auVar128._24_4_ = fVar137;
        auVar128._28_4_ = fVar137;
        auVar113 = vcmpps_avx(auVar113,auVar128,1);
        auVar172 = vblendvps_avx(ZEXT1632(auVar15),auVar124,auVar113);
        auVar21 = vblendvps_avx(ZEXT1632(auVar179),auVar20,auVar113);
        auVar113 = vandps_avx(ZEXT1632(auVar14),local_400);
        auVar122 = vandps_avx(ZEXT1632(auVar191),local_400);
        auVar122 = vmaxps_avx(auVar113,auVar122);
        auVar113 = vandps_avx(ZEXT1632(auVar26),local_400);
        auVar113 = vmaxps_avx(auVar122,auVar113);
        auVar122 = vcmpps_avx(auVar113,auVar128,1);
        auVar113 = vblendvps_avx(ZEXT1632(auVar14),auVar124,auVar122);
        auVar122 = vblendvps_avx(ZEXT1632(auVar191),auVar20,auVar122);
        auVar14 = vfmadd213ps_fma(auVar149,local_5c0,ZEXT1632(auVar155));
        auVar15 = vfmadd213ps_fma(auVar172,auVar172,ZEXT832(0) << 0x20);
        auVar15 = vfmadd231ps_fma(ZEXT1632(auVar15),auVar21,auVar21);
        auVar149 = vrsqrtps_avx(ZEXT1632(auVar15));
        fVar136 = auVar149._0_4_;
        fVar173 = auVar149._4_4_;
        fVar174 = auVar149._8_4_;
        fVar175 = auVar149._12_4_;
        fVar176 = auVar149._16_4_;
        fVar177 = auVar149._20_4_;
        fVar178 = auVar149._24_4_;
        auVar40._4_4_ = fVar173 * fVar173 * fVar173 * auVar15._4_4_ * -0.5;
        auVar40._0_4_ = fVar136 * fVar136 * fVar136 * auVar15._0_4_ * -0.5;
        auVar40._8_4_ = fVar174 * fVar174 * fVar174 * auVar15._8_4_ * -0.5;
        auVar40._12_4_ = fVar175 * fVar175 * fVar175 * auVar15._12_4_ * -0.5;
        auVar40._16_4_ = fVar176 * fVar176 * fVar176 * -0.0;
        auVar40._20_4_ = fVar177 * fVar177 * fVar177 * -0.0;
        auVar40._24_4_ = fVar178 * fVar178 * fVar178 * -0.0;
        auVar40._28_4_ = 0;
        auVar217._8_4_ = 0x3fc00000;
        auVar217._0_8_ = 0x3fc000003fc00000;
        auVar217._12_4_ = 0x3fc00000;
        auVar217._16_4_ = 0x3fc00000;
        auVar217._20_4_ = 0x3fc00000;
        auVar217._24_4_ = 0x3fc00000;
        auVar217._28_4_ = 0x3fc00000;
        auVar15 = vfmadd231ps_fma(auVar40,auVar217,auVar149);
        fVar136 = auVar15._0_4_;
        fVar173 = auVar15._4_4_;
        auVar41._4_4_ = auVar21._4_4_ * fVar173;
        auVar41._0_4_ = auVar21._0_4_ * fVar136;
        fVar174 = auVar15._8_4_;
        auVar41._8_4_ = auVar21._8_4_ * fVar174;
        fVar175 = auVar15._12_4_;
        auVar41._12_4_ = auVar21._12_4_ * fVar175;
        auVar41._16_4_ = auVar21._16_4_ * 0.0;
        auVar41._20_4_ = auVar21._20_4_ * 0.0;
        auVar41._24_4_ = auVar21._24_4_ * 0.0;
        auVar41._28_4_ = auVar149._28_4_;
        auVar42._4_4_ = -auVar172._4_4_ * fVar173;
        auVar42._0_4_ = -auVar172._0_4_ * fVar136;
        auVar42._8_4_ = -auVar172._8_4_ * fVar174;
        auVar42._12_4_ = -auVar172._12_4_ * fVar175;
        auVar42._16_4_ = -auVar172._16_4_ * 0.0;
        auVar42._20_4_ = -auVar172._20_4_ * 0.0;
        auVar42._24_4_ = -auVar172._24_4_ * 0.0;
        auVar42._28_4_ = auVar172._28_4_ ^ 0x80000000;
        auVar15 = vfmadd213ps_fma(auVar113,auVar113,ZEXT832(0) << 0x20);
        auVar15 = vfmadd231ps_fma(ZEXT1632(auVar15),auVar122,auVar122);
        auVar172 = vrsqrtps_avx(ZEXT1632(auVar15));
        auVar149 = ZEXT1632(CONCAT412(fVar175 * 0.0,
                                      CONCAT48(fVar174 * 0.0,CONCAT44(fVar173 * 0.0,fVar136 * 0.0)))
                           );
        fVar136 = auVar172._0_4_;
        fVar173 = auVar172._4_4_;
        fVar174 = auVar172._8_4_;
        fVar175 = auVar172._12_4_;
        fVar176 = auVar172._16_4_;
        fVar177 = auVar172._20_4_;
        fVar178 = auVar172._24_4_;
        auVar43._4_4_ = fVar173 * fVar173 * auVar15._4_4_ * -0.5 * fVar173;
        auVar43._0_4_ = fVar136 * fVar136 * auVar15._0_4_ * -0.5 * fVar136;
        auVar43._8_4_ = fVar174 * fVar174 * auVar15._8_4_ * -0.5 * fVar174;
        auVar43._12_4_ = fVar175 * fVar175 * auVar15._12_4_ * -0.5 * fVar175;
        auVar43._16_4_ = fVar176 * fVar176 * fVar176 * -0.0;
        auVar43._20_4_ = fVar177 * fVar177 * fVar177 * -0.0;
        auVar43._24_4_ = fVar178 * fVar178 * fVar178 * -0.0;
        auVar43._28_4_ = 0xbf000000;
        auVar15 = vfmadd231ps_fma(auVar43,auVar217,auVar172);
        fVar136 = auVar15._0_4_;
        fVar173 = auVar15._4_4_;
        auVar44._4_4_ = fVar173 * auVar122._4_4_;
        auVar44._0_4_ = fVar136 * auVar122._0_4_;
        fVar174 = auVar15._8_4_;
        auVar44._8_4_ = fVar174 * auVar122._8_4_;
        fVar175 = auVar15._12_4_;
        auVar44._12_4_ = fVar175 * auVar122._12_4_;
        auVar44._16_4_ = auVar122._16_4_ * 0.0;
        auVar44._20_4_ = auVar122._20_4_ * 0.0;
        auVar44._24_4_ = auVar122._24_4_ * 0.0;
        auVar44._28_4_ = 0;
        auVar45._4_4_ = fVar173 * -auVar113._4_4_;
        auVar45._0_4_ = fVar136 * -auVar113._0_4_;
        auVar45._8_4_ = fVar174 * -auVar113._8_4_;
        auVar45._12_4_ = fVar175 * -auVar113._12_4_;
        auVar45._16_4_ = -auVar113._16_4_ * 0.0;
        auVar45._20_4_ = -auVar113._20_4_ * 0.0;
        auVar45._24_4_ = -auVar113._24_4_ * 0.0;
        auVar45._28_4_ = 0;
        auVar46._28_4_ = auVar172._28_4_;
        auVar46._0_28_ =
             ZEXT1628(CONCAT412(fVar175 * 0.0,
                                CONCAT48(fVar174 * 0.0,CONCAT44(fVar173 * 0.0,fVar136 * 0.0))));
        auVar15 = vfmadd213ps_fma(auVar41,ZEXT1632(auVar110),local_4a0);
        auVar113 = ZEXT1632(auVar110);
        auVar155 = vfmadd213ps_fma(auVar42,auVar113,auVar115);
        auVar179 = vfmadd213ps_fma(auVar149,auVar113,ZEXT1632(auVar14));
        auVar26 = vfnmadd213ps_fma(auVar41,auVar113,local_4a0);
        auVar180 = vfmadd213ps_fma(auVar44,ZEXT1632(auVar190),local_460);
        auVar27 = vfnmadd213ps_fma(auVar42,auVar113,auVar115);
        auVar113 = ZEXT1632(auVar190);
        auVar191 = vfmadd213ps_fma(auVar45,auVar113,local_480);
        auVar183 = ZEXT1632(auVar110);
        auVar200 = vfnmadd231ps_fma(ZEXT1632(auVar14),auVar183,auVar149);
        auVar14 = vfmadd213ps_fma(auVar46,auVar113,ZEXT1632(auVar156));
        auVar28 = vfnmadd213ps_fma(auVar44,auVar113,local_460);
        auVar192 = vfnmadd213ps_fma(auVar45,auVar113,local_480);
        auVar205 = vfnmadd231ps_fma(ZEXT1632(auVar156),ZEXT1632(auVar190),auVar46);
        auVar113 = vsubps_avx(ZEXT1632(auVar191),ZEXT1632(auVar27));
        auVar122 = vsubps_avx(ZEXT1632(auVar14),ZEXT1632(auVar200));
        auVar145._0_4_ = auVar200._0_4_ * auVar113._0_4_;
        auVar145._4_4_ = auVar200._4_4_ * auVar113._4_4_;
        auVar145._8_4_ = auVar200._8_4_ * auVar113._8_4_;
        auVar145._12_4_ = auVar200._12_4_ * auVar113._12_4_;
        auVar145._16_4_ = auVar113._16_4_ * 0.0;
        auVar145._20_4_ = auVar113._20_4_ * 0.0;
        auVar145._24_4_ = auVar113._24_4_ * 0.0;
        auVar145._28_4_ = 0;
        auVar110 = vfmsub231ps_fma(auVar145,ZEXT1632(auVar27),auVar122);
        auVar47._4_4_ = auVar122._4_4_ * auVar26._4_4_;
        auVar47._0_4_ = auVar122._0_4_ * auVar26._0_4_;
        auVar47._8_4_ = auVar122._8_4_ * auVar26._8_4_;
        auVar47._12_4_ = auVar122._12_4_ * auVar26._12_4_;
        auVar47._16_4_ = auVar122._16_4_ * 0.0;
        auVar47._20_4_ = auVar122._20_4_ * 0.0;
        auVar47._24_4_ = auVar122._24_4_ * 0.0;
        auVar47._28_4_ = auVar122._28_4_;
        auVar122 = vsubps_avx(ZEXT1632(auVar180),ZEXT1632(auVar26));
        auVar156 = vfmsub231ps_fma(auVar47,ZEXT1632(auVar200),auVar122);
        auVar48._4_4_ = auVar27._4_4_ * auVar122._4_4_;
        auVar48._0_4_ = auVar27._0_4_ * auVar122._0_4_;
        auVar48._8_4_ = auVar27._8_4_ * auVar122._8_4_;
        auVar48._12_4_ = auVar27._12_4_ * auVar122._12_4_;
        auVar48._16_4_ = auVar122._16_4_ * 0.0;
        auVar48._20_4_ = auVar122._20_4_ * 0.0;
        auVar48._24_4_ = auVar122._24_4_ * 0.0;
        auVar48._28_4_ = auVar122._28_4_;
        auVar168 = ZEXT1632(auVar26);
        auVar26 = vfmsub231ps_fma(auVar48,auVar168,auVar113);
        auVar156 = vfmadd231ps_fma(ZEXT1632(auVar26),ZEXT832(0) << 0x20,ZEXT1632(auVar156));
        auVar156 = vfmadd231ps_fma(ZEXT1632(auVar156),ZEXT832(0) << 0x20,ZEXT1632(auVar110));
        auVar126 = vcmpps_avx(ZEXT1632(auVar156),ZEXT832(0) << 0x20,2);
        auVar113 = vblendvps_avx(ZEXT1632(auVar28),ZEXT1632(auVar15),auVar126);
        auVar122 = vblendvps_avx(ZEXT1632(auVar192),ZEXT1632(auVar155),auVar126);
        auVar172 = vblendvps_avx(ZEXT1632(auVar205),ZEXT1632(auVar179),auVar126);
        auVar149 = vblendvps_avx(auVar168,ZEXT1632(auVar180),auVar126);
        auVar21 = vblendvps_avx(ZEXT1632(auVar27),ZEXT1632(auVar191),auVar126);
        auVar22 = vblendvps_avx(ZEXT1632(auVar200),ZEXT1632(auVar14),auVar126);
        auVar168 = vblendvps_avx(ZEXT1632(auVar180),auVar168,auVar126);
        auVar23 = vblendvps_avx(ZEXT1632(auVar191),ZEXT1632(auVar27),auVar126);
        auVar156 = vpackssdw_avx(local_4e0._0_16_,local_4e0._16_16_);
        auVar124 = vblendvps_avx(ZEXT1632(auVar14),ZEXT1632(auVar200),auVar126);
        auVar115 = vsubps_avx(auVar168,auVar113);
        auVar143 = vsubps_avx(auVar23,auVar122);
        auVar165 = vsubps_avx(auVar124,auVar172);
        auVar193 = vsubps_avx(auVar113,auVar149);
        auVar185 = vsubps_avx(auVar122,auVar21);
        auVar196 = vsubps_avx(auVar172,auVar22);
        auVar49._4_4_ = auVar165._4_4_ * auVar113._4_4_;
        auVar49._0_4_ = auVar165._0_4_ * auVar113._0_4_;
        auVar49._8_4_ = auVar165._8_4_ * auVar113._8_4_;
        auVar49._12_4_ = auVar165._12_4_ * auVar113._12_4_;
        auVar49._16_4_ = auVar165._16_4_ * auVar113._16_4_;
        auVar49._20_4_ = auVar165._20_4_ * auVar113._20_4_;
        auVar49._24_4_ = auVar165._24_4_ * auVar113._24_4_;
        auVar49._28_4_ = auVar124._28_4_;
        auVar14 = vfmsub231ps_fma(auVar49,auVar172,auVar115);
        auVar50._4_4_ = auVar122._4_4_ * auVar115._4_4_;
        auVar50._0_4_ = auVar122._0_4_ * auVar115._0_4_;
        auVar50._8_4_ = auVar122._8_4_ * auVar115._8_4_;
        auVar50._12_4_ = auVar122._12_4_ * auVar115._12_4_;
        auVar50._16_4_ = auVar122._16_4_ * auVar115._16_4_;
        auVar50._20_4_ = auVar122._20_4_ * auVar115._20_4_;
        auVar50._24_4_ = auVar122._24_4_ * auVar115._24_4_;
        auVar50._28_4_ = auVar168._28_4_;
        auVar15 = vfmsub231ps_fma(auVar50,auVar113,auVar143);
        auVar199 = ZEXT864(0) << 0x20;
        auVar14 = vfmadd231ps_fma(ZEXT1632(auVar15),ZEXT832(0) << 0x20,ZEXT1632(auVar14));
        auVar119._0_4_ = auVar143._0_4_ * auVar172._0_4_;
        auVar119._4_4_ = auVar143._4_4_ * auVar172._4_4_;
        auVar119._8_4_ = auVar143._8_4_ * auVar172._8_4_;
        auVar119._12_4_ = auVar143._12_4_ * auVar172._12_4_;
        auVar119._16_4_ = auVar143._16_4_ * auVar172._16_4_;
        auVar119._20_4_ = auVar143._20_4_ * auVar172._20_4_;
        auVar119._24_4_ = auVar143._24_4_ * auVar172._24_4_;
        auVar119._28_4_ = 0;
        auVar15 = vfmsub231ps_fma(auVar119,auVar122,auVar165);
        auVar15 = vfmadd231ps_fma(ZEXT1632(auVar14),ZEXT832(0) << 0x20,ZEXT1632(auVar15));
        auVar120._0_4_ = auVar196._0_4_ * auVar149._0_4_;
        auVar120._4_4_ = auVar196._4_4_ * auVar149._4_4_;
        auVar120._8_4_ = auVar196._8_4_ * auVar149._8_4_;
        auVar120._12_4_ = auVar196._12_4_ * auVar149._12_4_;
        auVar120._16_4_ = auVar196._16_4_ * auVar149._16_4_;
        auVar120._20_4_ = auVar196._20_4_ * auVar149._20_4_;
        auVar120._24_4_ = auVar196._24_4_ * auVar149._24_4_;
        auVar120._28_4_ = 0;
        auVar14 = vfmsub231ps_fma(auVar120,auVar193,auVar22);
        auVar51._4_4_ = auVar185._4_4_ * auVar22._4_4_;
        auVar51._0_4_ = auVar185._0_4_ * auVar22._0_4_;
        auVar51._8_4_ = auVar185._8_4_ * auVar22._8_4_;
        auVar51._12_4_ = auVar185._12_4_ * auVar22._12_4_;
        auVar51._16_4_ = auVar185._16_4_ * auVar22._16_4_;
        auVar51._20_4_ = auVar185._20_4_ * auVar22._20_4_;
        auVar51._24_4_ = auVar185._24_4_ * auVar22._24_4_;
        auVar51._28_4_ = auVar22._28_4_;
        auVar110 = vfmsub231ps_fma(auVar51,auVar21,auVar196);
        auVar52._4_4_ = auVar193._4_4_ * auVar21._4_4_;
        auVar52._0_4_ = auVar193._0_4_ * auVar21._0_4_;
        auVar52._8_4_ = auVar193._8_4_ * auVar21._8_4_;
        auVar52._12_4_ = auVar193._12_4_ * auVar21._12_4_;
        auVar52._16_4_ = auVar193._16_4_ * auVar21._16_4_;
        auVar52._20_4_ = auVar193._20_4_ * auVar21._20_4_;
        auVar52._24_4_ = auVar193._24_4_ * auVar21._24_4_;
        auVar52._28_4_ = auVar23._28_4_;
        auVar155 = vfmsub231ps_fma(auVar52,auVar185,auVar149);
        auVar14 = vfmadd231ps_fma(ZEXT1632(auVar155),ZEXT832(0) << 0x20,ZEXT1632(auVar14));
        auVar110 = vfmadd231ps_fma(ZEXT1632(auVar14),ZEXT832(0) << 0x20,ZEXT1632(auVar110));
        auVar149 = vmaxps_avx(ZEXT1632(auVar15),ZEXT1632(auVar110));
        auVar149 = vcmpps_avx(auVar149,ZEXT832(0) << 0x20,2);
        auVar14 = vpackssdw_avx(auVar149._0_16_,auVar149._16_16_);
        auVar156 = vpand_avx(auVar14,auVar156);
        auVar149 = vpmovsxwd_avx2(auVar156);
        if ((((((((auVar149 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar149 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar149 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar149 >> 0x7f,0) == '\0') &&
              (auVar149 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar149 >> 0xbf,0) == '\0') &&
            (auVar149 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar149[0x1f]) {
LAB_018405b5:
          auVar188 = ZEXT3264(CONCAT824(uStack_628,
                                        CONCAT816(uStack_630,CONCAT88(uStack_638,local_640))));
          auVar206 = ZEXT3264(auVar133);
        }
        else {
          auVar53._4_4_ = auVar143._4_4_ * auVar196._4_4_;
          auVar53._0_4_ = auVar143._0_4_ * auVar196._0_4_;
          auVar53._8_4_ = auVar143._8_4_ * auVar196._8_4_;
          auVar53._12_4_ = auVar143._12_4_ * auVar196._12_4_;
          auVar53._16_4_ = auVar143._16_4_ * auVar196._16_4_;
          auVar53._20_4_ = auVar143._20_4_ * auVar196._20_4_;
          auVar53._24_4_ = auVar143._24_4_ * auVar196._24_4_;
          auVar53._28_4_ = auVar149._28_4_;
          auVar180 = vfmsub231ps_fma(auVar53,auVar185,auVar165);
          auVar129._0_4_ = auVar165._0_4_ * auVar193._0_4_;
          auVar129._4_4_ = auVar165._4_4_ * auVar193._4_4_;
          auVar129._8_4_ = auVar165._8_4_ * auVar193._8_4_;
          auVar129._12_4_ = auVar165._12_4_ * auVar193._12_4_;
          auVar129._16_4_ = auVar165._16_4_ * auVar193._16_4_;
          auVar129._20_4_ = auVar165._20_4_ * auVar193._20_4_;
          auVar129._24_4_ = auVar165._24_4_ * auVar193._24_4_;
          auVar129._28_4_ = 0;
          auVar179 = vfmsub231ps_fma(auVar129,auVar115,auVar196);
          auVar54._4_4_ = auVar185._4_4_ * auVar115._4_4_;
          auVar54._0_4_ = auVar185._0_4_ * auVar115._0_4_;
          auVar54._8_4_ = auVar185._8_4_ * auVar115._8_4_;
          auVar54._12_4_ = auVar185._12_4_ * auVar115._12_4_;
          auVar54._16_4_ = auVar185._16_4_ * auVar115._16_4_;
          auVar54._20_4_ = auVar185._20_4_ * auVar115._20_4_;
          auVar54._24_4_ = auVar185._24_4_ * auVar115._24_4_;
          auVar54._28_4_ = auVar21._28_4_;
          auVar191 = vfmsub231ps_fma(auVar54,auVar193,auVar143);
          auVar14 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar179),ZEXT1632(auVar191));
          auVar155 = vfmadd231ps_fma(ZEXT1632(auVar14),ZEXT1632(auVar180),_DAT_01faff00);
          auVar149 = vrcpps_avx(ZEXT1632(auVar155));
          auVar202._8_4_ = 0x3f800000;
          auVar202._0_8_ = 0x3f8000003f800000;
          auVar202._12_4_ = 0x3f800000;
          auVar202._16_4_ = 0x3f800000;
          auVar202._20_4_ = 0x3f800000;
          auVar202._24_4_ = 0x3f800000;
          auVar202._28_4_ = 0x3f800000;
          auVar14 = vfnmadd213ps_fma(auVar149,ZEXT1632(auVar155),auVar202);
          auVar14 = vfmadd132ps_fma(ZEXT1632(auVar14),auVar149,auVar149);
          auVar184._0_4_ = auVar191._0_4_ * auVar172._0_4_;
          auVar184._4_4_ = auVar191._4_4_ * auVar172._4_4_;
          auVar184._8_4_ = auVar191._8_4_ * auVar172._8_4_;
          auVar184._12_4_ = auVar191._12_4_ * auVar172._12_4_;
          auVar184._16_4_ = auVar172._16_4_ * 0.0;
          auVar184._20_4_ = auVar172._20_4_ * 0.0;
          auVar184._24_4_ = auVar172._24_4_ * 0.0;
          auVar184._28_4_ = 0;
          auVar179 = vfmadd231ps_fma(auVar184,auVar122,ZEXT1632(auVar179));
          auVar179 = vfmadd231ps_fma(ZEXT1632(auVar179),ZEXT1632(auVar180),auVar113);
          fVar136 = auVar14._0_4_;
          fVar173 = auVar14._4_4_;
          fVar174 = auVar14._8_4_;
          fVar175 = auVar14._12_4_;
          auVar172 = ZEXT1632(CONCAT412(fVar175 * auVar179._12_4_,
                                        CONCAT48(fVar174 * auVar179._8_4_,
                                                 CONCAT44(fVar173 * auVar179._4_4_,
                                                          fVar136 * auVar179._0_4_))));
          auVar121._4_4_ = local_620;
          auVar121._0_4_ = local_620;
          auVar121._8_4_ = local_620;
          auVar121._12_4_ = local_620;
          auVar121._16_4_ = local_620;
          auVar121._20_4_ = local_620;
          auVar121._24_4_ = local_620;
          auVar121._28_4_ = local_620;
          uVar108 = *(undefined4 *)(ray + k * 4 + 0x100);
          auVar130._4_4_ = uVar108;
          auVar130._0_4_ = uVar108;
          auVar130._8_4_ = uVar108;
          auVar130._12_4_ = uVar108;
          auVar130._16_4_ = uVar108;
          auVar130._20_4_ = uVar108;
          auVar130._24_4_ = uVar108;
          auVar130._28_4_ = uVar108;
          auVar113 = vcmpps_avx(auVar121,auVar172,2);
          auVar122 = vcmpps_avx(auVar172,auVar130,2);
          auVar113 = vandps_avx(auVar122,auVar113);
          auVar14 = vpackssdw_avx(auVar113._0_16_,auVar113._16_16_);
          auVar156 = vpand_avx(auVar156,auVar14);
          auVar113 = vpmovsxwd_avx2(auVar156);
          auVar199 = ZEXT864(0) << 0x20;
          if ((((((((auVar113 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar113 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar113 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar113 >> 0x7f,0) == '\0') &&
                (auVar113 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar113 >> 0xbf,0) == '\0') &&
              (auVar113 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar113[0x1f]) goto LAB_018405b5;
          auVar113 = vcmpps_avx(ZEXT832(0) << 0x20,ZEXT1632(auVar155),4);
          auVar14 = vpackssdw_avx(auVar113._0_16_,auVar113._16_16_);
          auVar156 = vpand_avx(auVar156,auVar14);
          auVar113 = vpmovsxwd_avx2(auVar156);
          auVar188 = ZEXT3264(CONCAT824(uStack_628,
                                        CONCAT816(uStack_630,CONCAT88(uStack_638,local_640))));
          auVar206 = ZEXT3264(auVar133);
          if ((((((((auVar113 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar113 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar113 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar113 >> 0x7f,0) != '\0') ||
                (auVar113 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar113 >> 0xbf,0) != '\0') ||
              (auVar113 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar113[0x1f] < '\0') {
            auVar122 = ZEXT1632(CONCAT412(fVar175 * auVar15._12_4_,
                                          CONCAT48(fVar174 * auVar15._8_4_,
                                                   CONCAT44(fVar173 * auVar15._4_4_,
                                                            fVar136 * auVar15._0_4_))));
            auVar55._28_4_ = local_580._28_4_;
            auVar55._0_28_ =
                 ZEXT1628(CONCAT412(fVar175 * auVar110._12_4_,
                                    CONCAT48(fVar174 * auVar110._8_4_,
                                             CONCAT44(fVar173 * auVar110._4_4_,
                                                      fVar136 * auVar110._0_4_))));
            auVar163._8_4_ = 0x3f800000;
            auVar163._0_8_ = 0x3f8000003f800000;
            auVar163._12_4_ = 0x3f800000;
            auVar163._16_4_ = 0x3f800000;
            auVar163._20_4_ = 0x3f800000;
            auVar163._24_4_ = 0x3f800000;
            auVar163._28_4_ = 0x3f800000;
            auVar133 = vsubps_avx(auVar163,auVar122);
            auVar133 = vblendvps_avx(auVar133,auVar122,auVar126);
            auVar206 = ZEXT3264(auVar133);
            auVar133 = vsubps_avx(auVar163,auVar55);
            local_500 = vblendvps_avx(auVar133,auVar55,auVar126);
            auVar188 = ZEXT3264(auVar113);
            local_580 = auVar172;
          }
        }
        auVar213 = ZEXT3264(_local_6e0);
        auVar113 = auVar188._0_32_;
        if ((((((((auVar113 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar113 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar113 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar113 >> 0x7f,0) == '\0') &&
              (auVar188 & (undefined1  [64])0x100000000) == (undefined1  [64])0x0) &&
             SUB321(auVar113 >> 0xbf,0) == '\0') &&
            (auVar188 & (undefined1  [64])0x100000000) == (undefined1  [64])0x0) &&
            -1 < auVar188[0x1f]) goto LAB_0183f142;
        auVar133 = vsubps_avx(ZEXT1632(auVar190),auVar183);
        auVar172 = auVar206._0_32_;
        auVar156 = vfmadd213ps_fma(auVar133,auVar172,auVar183);
        fVar136 = *(float *)((long)pre->ray_space + k * 4 + -0x20);
        auVar133._4_4_ = (auVar156._4_4_ + auVar156._4_4_) * fVar136;
        auVar133._0_4_ = (auVar156._0_4_ + auVar156._0_4_) * fVar136;
        auVar133._8_4_ = (auVar156._8_4_ + auVar156._8_4_) * fVar136;
        auVar133._12_4_ = (auVar156._12_4_ + auVar156._12_4_) * fVar136;
        auVar133._16_4_ = fVar136 * 0.0;
        auVar133._20_4_ = fVar136 * 0.0;
        auVar133._24_4_ = fVar136 * 0.0;
        auVar133._28_4_ = 0;
        auVar133 = vcmpps_avx(local_580,auVar133,6);
        auVar122 = auVar113 & auVar133;
        auVar194 = ZEXT3264(CONCAT428(fVar207,CONCAT424(fVar207,CONCAT420(fVar207,CONCAT416(fVar207,
                                                  CONCAT412(fVar207,CONCAT48(fVar207,CONCAT44(
                                                  fVar207,fVar207))))))));
        auVar188 = ZEXT3264(CONCAT428(fVar226,CONCAT424(fVar223,CONCAT420(fVar226,CONCAT416(fVar223,
                                                  CONCAT412(fVar226,CONCAT48(fVar223,uVar109)))))));
        if ((((((((auVar122 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar122 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar122 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar122 >> 0x7f,0) != '\0') ||
              (auVar122 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar122 >> 0xbf,0) != '\0') ||
            (auVar122 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar122[0x1f] < '\0') {
          auVar131._8_4_ = 0xbf800000;
          auVar131._0_8_ = 0xbf800000bf800000;
          auVar131._12_4_ = 0xbf800000;
          auVar131._16_4_ = 0xbf800000;
          auVar131._20_4_ = 0xbf800000;
          auVar131._24_4_ = 0xbf800000;
          auVar131._28_4_ = 0xbf800000;
          auVar146._8_4_ = 0x40000000;
          auVar146._0_8_ = 0x4000000040000000;
          auVar146._12_4_ = 0x40000000;
          auVar146._16_4_ = 0x40000000;
          auVar146._20_4_ = 0x40000000;
          auVar146._24_4_ = 0x40000000;
          auVar146._28_4_ = 0x40000000;
          auVar156 = vfmadd213ps_fma(local_500,auVar146,auVar131);
          local_3a0 = ZEXT1632(auVar156);
          local_360 = 0;
          local_500 = local_3a0;
          if ((pGVar17->mask & *(uint *)(ray + k * 4 + 0x120)) != 0) {
            if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
               (bVar100 = true, pGVar17->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
              auVar113 = vandps_avx(auVar133,auVar113);
              fVar136 = 1.0 / auVar117._0_4_;
              local_2e0[0] = fVar136 * (auVar206._0_4_ + 0.0);
              local_2e0[1] = fVar136 * (auVar206._4_4_ + 1.0);
              local_2e0[2] = fVar136 * (auVar206._8_4_ + 2.0);
              local_2e0[3] = fVar136 * (auVar206._12_4_ + 3.0);
              fStack_2d0 = fVar136 * (auVar206._16_4_ + 4.0);
              fStack_2cc = fVar136 * (auVar206._20_4_ + 5.0);
              fStack_2c8 = fVar136 * (auVar206._24_4_ + 6.0);
              fStack_2c4 = auVar206._28_4_ + 7.0;
              local_500._0_8_ = auVar156._0_8_;
              local_500._8_8_ = auVar156._8_8_;
              local_2c0 = local_500._0_8_;
              uStack_2b8 = local_500._8_8_;
              uStack_2b0 = 0;
              uStack_2a8 = 0;
              local_2a0 = local_580;
              uVar101 = vmovmskps_avx(auVar113);
              if (uVar101 == 0) goto LAB_0183f21a;
              uVar103 = 0;
              uVar105 = (ulong)(uVar101 & 0xff);
              for (uVar104 = uVar105; (uVar104 & 1) == 0;
                  uVar104 = uVar104 >> 1 | 0x8000000000000000) {
                uVar103 = uVar103 + 1;
              }
              local_920._0_4_ = local_920._4_4_;
              local_920._8_4_ = local_920._4_4_;
              local_920._12_4_ = local_920._4_4_;
              local_920._16_4_ = local_920._4_4_;
              local_920._20_4_ = local_920._4_4_;
              local_920._24_4_ = local_920._4_4_;
              local_920._28_4_ = local_920._4_4_;
              local_6a0._0_4_ = local_6a0._4_4_;
              local_6a0._8_4_ = local_6a0._4_4_;
              local_6a0._12_4_ = local_6a0._4_4_;
              local_6a0._16_4_ = local_6a0._4_4_;
              local_6a0._20_4_ = local_6a0._4_4_;
              local_6a0._24_4_ = local_6a0._4_4_;
              local_6a0._28_4_ = local_6a0._4_4_;
              local_6c0 = ZEXT1632(CONCAT124(auVar190._4_12_,*(undefined4 *)(ray + k * 4 + 0x100)));
              _local_5e0 = auVar20;
              local_3c0 = auVar172;
              local_380 = local_580;
              local_35c = iVar102;
              local_350 = uVar189;
              uStack_348 = uVar91;
              local_340 = uVar92;
              uStack_338 = uVar93;
              local_330 = uVar94;
              uStack_328 = uVar95;
              do {
                fVar136 = local_2e0[uVar103];
                auVar111._4_4_ = fVar136;
                auVar111._0_4_ = fVar136;
                auVar111._8_4_ = fVar136;
                auVar111._12_4_ = fVar136;
                local_220._16_4_ = fVar136;
                local_220._0_16_ = auVar111;
                local_220._20_4_ = fVar136;
                local_220._24_4_ = fVar136;
                local_220._28_4_ = fVar136;
                local_200 = *(undefined4 *)((long)&local_2c0 + uVar103 * 4);
                *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_2a0 + uVar103 * 4);
                fVar174 = 1.0 - fVar136;
                auVar156 = ZEXT416((uint)(fVar136 * fVar174 * 4.0));
                auVar14 = vfnmsub213ss_fma(auVar111,auVar111,auVar156);
                auVar156 = vfmadd213ss_fma(ZEXT416((uint)fVar174),ZEXT416((uint)fVar174),auVar156);
                fVar173 = auVar156._0_4_ * 0.5;
                fVar136 = fVar136 * fVar136 * 0.5;
                auVar157._0_4_ = fVar136 * local_6f0;
                auVar157._4_4_ = fVar136 * fStack_6ec;
                auVar157._8_4_ = fVar136 * fStack_6e8;
                auVar157._12_4_ = fVar136 * fStack_6e4;
                auVar138._4_4_ = fVar173;
                auVar138._0_4_ = fVar173;
                auVar138._8_4_ = fVar173;
                auVar138._12_4_ = fVar173;
                auVar156 = vfmadd132ps_fma(auVar138,auVar157,auVar159);
                fVar136 = auVar14._0_4_ * 0.5;
                auVar158._4_4_ = fVar136;
                auVar158._0_4_ = fVar136;
                auVar158._8_4_ = fVar136;
                auVar158._12_4_ = fVar136;
                auVar156 = vfmadd132ps_fma(auVar158,auVar156,auVar19);
                local_770.context = context->user;
                fVar136 = fVar174 * -fVar174 * 0.5;
                auVar139._4_4_ = fVar136;
                auVar139._0_4_ = fVar136;
                auVar139._8_4_ = fVar136;
                auVar139._12_4_ = fVar136;
                auVar14 = vfmadd132ps_fma(auVar139,auVar156,auVar10);
                local_280 = auVar14._0_4_;
                uStack_27c = local_280;
                uStack_278 = local_280;
                uStack_274 = local_280;
                uStack_270 = local_280;
                uStack_26c = local_280;
                uStack_268 = local_280;
                uStack_264 = local_280;
                auVar156 = vmovshdup_avx(auVar14);
                local_260 = auVar156._0_8_;
                uStack_258 = local_260;
                uStack_250 = local_260;
                uStack_248 = local_260;
                auVar156 = vshufps_avx(auVar14,auVar14,0xaa);
                auVar140._0_8_ = auVar156._0_8_;
                auVar140._8_8_ = auVar140._0_8_;
                auVar147._16_8_ = auVar140._0_8_;
                auVar147._0_16_ = auVar140;
                auVar147._24_8_ = auVar140._0_8_;
                local_240 = auVar147;
                uStack_1fc = local_200;
                uStack_1f8 = local_200;
                uStack_1f4 = local_200;
                uStack_1f0 = local_200;
                uStack_1ec = local_200;
                uStack_1e8 = local_200;
                uStack_1e4 = local_200;
                local_1e0 = local_6a0._0_8_;
                uStack_1d8 = local_6a0._8_8_;
                uStack_1d0 = local_6a0._16_8_;
                uStack_1c8 = local_6a0._24_8_;
                local_1c0 = local_920;
                vpcmpeqd_avx2(local_920,local_920);
                local_1a0 = (local_770.context)->instID[0];
                uStack_19c = local_1a0;
                uStack_198 = local_1a0;
                uStack_194 = local_1a0;
                uStack_190 = local_1a0;
                uStack_18c = local_1a0;
                uStack_188 = local_1a0;
                uStack_184 = local_1a0;
                local_180 = (local_770.context)->instPrimID[0];
                uStack_17c = local_180;
                uStack_178 = local_180;
                uStack_174 = local_180;
                uStack_170 = local_180;
                uStack_16c = local_180;
                uStack_168 = local_180;
                uStack_164 = local_180;
                local_680 = local_420;
                local_770.valid = (int *)local_680;
                local_770.geometryUserPtr = pGVar17->userPtr;
                local_770.hit = (RTCHitN *)&local_280;
                local_770.N = 8;
                local_770.ray = (RTCRayN *)ray;
                if (pGVar17->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                  auVar147 = ZEXT1632(auVar140);
                  (*pGVar17->occlusionFilterN)(&local_770);
                  auVar213 = ZEXT3264(_local_6e0);
                  auVar194 = ZEXT3264(CONCAT428(fVar207,CONCAT424(fVar207,CONCAT420(fVar207,
                                                  CONCAT416(fVar207,CONCAT412(fVar207,CONCAT48(
                                                  fVar207,CONCAT44(fVar207,fVar207))))))));
                  auVar206 = ZEXT3264(auVar172);
                  auVar199 = ZEXT1664(ZEXT816(0) << 0x40);
                }
                auVar133 = vpcmpeqd_avx2(auVar199._0_32_,local_680);
                auVar122 = vpcmpeqd_avx2(auVar147,auVar147);
                auVar113 = auVar122 & ~auVar133;
                if ((((((((auVar113 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                         (auVar113 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                        (auVar113 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                       SUB321(auVar113 >> 0x7f,0) == '\0') &&
                      (auVar113 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                     SUB321(auVar113 >> 0xbf,0) == '\0') &&
                    (auVar113 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                    -1 < auVar113[0x1f]) {
                  auVar133 = auVar133 ^ auVar122;
                }
                else {
                  p_Var18 = context->args->filter;
                  if ((p_Var18 != (RTCFilterFunctionN)0x0) &&
                     (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                       RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar17->field_8).field_0x2 & 0x40) != 0)
                      ))) {
                    (*p_Var18)(&local_770);
                    auVar213 = ZEXT3264(_local_6e0);
                    auVar194 = ZEXT3264(CONCAT428(fVar207,CONCAT424(fVar207,CONCAT420(fVar207,
                                                  CONCAT416(fVar207,CONCAT412(fVar207,CONCAT48(
                                                  fVar207,CONCAT44(fVar207,fVar207))))))));
                    auVar206 = ZEXT3264(auVar172);
                    auVar199 = ZEXT1664(ZEXT816(0) << 0x40);
                  }
                  auVar113 = vpcmpeqd_avx2(auVar199._0_32_,local_680);
                  auVar133 = vpcmpeqd_avx2(local_680,local_680);
                  auVar133 = auVar113 ^ auVar133;
                  auVar148._8_4_ = 0xff800000;
                  auVar148._0_8_ = 0xff800000ff800000;
                  auVar148._12_4_ = 0xff800000;
                  auVar148._16_4_ = 0xff800000;
                  auVar148._20_4_ = 0xff800000;
                  auVar148._24_4_ = 0xff800000;
                  auVar148._28_4_ = 0xff800000;
                  auVar113 = vblendvps_avx(auVar148,*(undefined1 (*) [32])(local_770.ray + 0x100),
                                           auVar113);
                  *(undefined1 (*) [32])(local_770.ray + 0x100) = auVar113;
                }
                auVar188 = ZEXT3264(CONCAT428(fVar226,CONCAT424(fVar223,CONCAT420(fVar226,CONCAT416(
                                                  fVar223,CONCAT412(fVar226,CONCAT48(fVar223,uVar109
                                                                                    )))))));
                if ((((((((auVar133 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                         (auVar133 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        (auVar133 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       SUB321(auVar133 >> 0x7f,0) != '\0') ||
                      (auVar133 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     SUB321(auVar133 >> 0xbf,0) != '\0') ||
                    (auVar133 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                    auVar133[0x1f] < '\0') {
                  bVar100 = true;
                  break;
                }
                *(undefined4 *)(ray + k * 4 + 0x100) = local_6c0._0_4_;
                uVar104 = uVar103 & 0x3f;
                bVar100 = false;
                uVar103 = 0;
                uVar105 = uVar105 ^ 1L << uVar104;
                for (uVar104 = uVar105; (uVar104 & 1) == 0;
                    uVar104 = uVar104 >> 1 | 0x8000000000000000) {
                  uVar103 = uVar103 + 1;
                }
              } while (uVar105 != 0);
            }
            goto LAB_0183f166;
          }
          goto LAB_0183f15d;
        }
LAB_0183f21a:
        bVar100 = false;
      }
LAB_0183f166:
      auVar203 = ZEXT3264(auVar152);
      auVar135 = ZEXT3264(local_720);
      auVar199 = ZEXT3264(local_740);
      if (8 < iVar102) {
        local_4e0._4_4_ = fVar137;
        local_4e0._0_4_ = fVar137;
        fStack_4d8 = fVar137;
        fStack_4d4 = fVar137;
        fStack_4d0 = fVar137;
        fStack_4cc = fVar137;
        fStack_4c8 = fVar137;
        fStack_4c4 = fVar137;
        local_120 = local_620;
        uStack_11c = local_620;
        uStack_118 = local_620;
        uStack_114 = local_620;
        uStack_110 = local_620;
        uStack_10c = local_620;
        uStack_108 = local_620;
        uStack_104 = local_620;
        local_160 = 1.0 / (float)local_540._0_4_;
        fStack_15c = local_160;
        fStack_158 = local_160;
        fStack_154 = local_160;
        fStack_150 = local_160;
        fStack_14c = local_160;
        fStack_148 = local_160;
        fStack_144 = local_160;
        local_140 = local_920._4_4_;
        uStack_13c = local_920._4_4_;
        uStack_138 = local_920._4_4_;
        uStack_134 = local_920._4_4_;
        uStack_130 = local_920._4_4_;
        uStack_12c = local_920._4_4_;
        uStack_128 = local_920._4_4_;
        uStack_124 = local_920._4_4_;
        local_560 = CONCAT44((undefined4)local_560,(undefined4)local_560);
        uStack_558 = (undefined4)local_560;
        uStack_554 = (undefined4)local_560;
        uStack_550 = (undefined4)local_560;
        uStack_54c = (undefined4)local_560;
        uStack_548 = (undefined4)local_560;
        uStack_544 = (undefined4)local_560;
        lVar106 = 8;
        auVar113 = auVar206._0_32_;
        _local_6e0 = auVar213._0_32_;
        local_4c0 = (float)iVar102;
        fStack_4bc = (float)iVar102;
        fStack_4b8 = (float)iVar102;
        fStack_4b4 = (float)iVar102;
        fStack_4b0 = (float)iVar102;
        fStack_4ac = (float)iVar102;
        fStack_4a8 = (float)iVar102;
        iStack_4a4 = iVar102;
        do {
          auVar126 = auVar199._0_32_;
          local_720 = auVar135._0_32_;
          auVar133 = *(undefined1 (*) [32])(bspline_basis0 + lVar106 * 4 + lVar24);
          auVar122 = *(undefined1 (*) [32])(lVar24 + 0x21aefac + lVar106 * 4);
          auVar172 = *(undefined1 (*) [32])(lVar24 + 0x21af430 + lVar106 * 4);
          pauVar5 = (undefined1 (*) [32])(lVar24 + 0x21af8b4 + lVar106 * 4);
          fVar178 = *(float *)*pauVar5;
          fVar208 = *(float *)(*pauVar5 + 4);
          fVar214 = *(float *)(*pauVar5 + 8);
          fVar218 = *(float *)(*pauVar5 + 0xc);
          fVar219 = *(float *)(*pauVar5 + 0x10);
          fVar220 = *(float *)(*pauVar5 + 0x14);
          fVar221 = *(float *)(*pauVar5 + 0x18);
          auVar98 = *(undefined1 (*) [28])*pauVar5;
          auVar212._0_4_ = auVar194._0_4_ * fVar178;
          auVar212._4_4_ = auVar194._4_4_ * fVar208;
          auVar212._8_4_ = auVar194._8_4_ * fVar214;
          auVar212._12_4_ = auVar194._12_4_ * fVar218;
          auVar212._16_4_ = auVar194._16_4_ * fVar219;
          auVar212._20_4_ = auVar194._20_4_ * fVar220;
          auVar212._28_36_ = auVar213._28_36_;
          auVar212._24_4_ = auVar194._24_4_ * fVar221;
          auVar213._0_4_ = auVar188._0_4_ * fVar178;
          auVar213._4_4_ = auVar188._4_4_ * fVar208;
          auVar213._8_4_ = auVar188._8_4_ * fVar214;
          auVar213._12_4_ = auVar188._12_4_ * fVar218;
          auVar213._16_4_ = auVar188._16_4_ * fVar219;
          auVar213._20_4_ = auVar188._20_4_ * fVar220;
          auVar213._28_36_ = auVar135._28_36_;
          auVar213._24_4_ = auVar188._24_4_ * fVar221;
          auVar159 = vfmadd231ps_fma(auVar212._0_32_,auVar172,auVar144);
          auVar19 = vfmadd231ps_fma(auVar213._0_32_,auVar172,auVar166);
          auVar159 = vfmadd231ps_fma(ZEXT1632(auVar159),auVar122,auVar216);
          auVar115 = auVar203._0_32_;
          auVar19 = vfmadd231ps_fma(ZEXT1632(auVar19),auVar122,auVar115);
          auVar159 = vfmadd231ps_fma(ZEXT1632(auVar159),auVar133,auVar162);
          auVar19 = vfmadd231ps_fma(ZEXT1632(auVar19),auVar133,local_600);
          auVar124 = *(undefined1 (*) [32])(bspline_basis1 + lVar106 * 4 + lVar24);
          pauVar6 = (undefined1 (*) [32])(lVar24 + 0x21b13cc + lVar106 * 4);
          uStack_61c = *(undefined4 *)(*pauVar6 + 4);
          uStack_618 = *(undefined4 *)(*pauVar6 + 8);
          uStack_614 = *(undefined4 *)(*pauVar6 + 0xc);
          uStack_610 = *(undefined4 *)(*pauVar6 + 0x10);
          uStack_60c = *(undefined4 *)(*pauVar6 + 0x14);
          uStack_608 = *(undefined4 *)(*pauVar6 + 0x18);
          uStack_604 = *(undefined4 *)(*pauVar6 + 0x1c);
          auVar20 = *pauVar6;
          auVar149 = *(undefined1 (*) [32])(lVar24 + 0x21b1850 + lVar106 * 4);
          pfVar7 = (float *)(lVar24 + 0x21b1cd4 + lVar106 * 4);
          fVar222 = *pfVar7;
          fVar85 = pfVar7[1];
          fVar86 = pfVar7[2];
          fVar87 = pfVar7[3];
          fVar88 = pfVar7[4];
          fVar89 = pfVar7[5];
          fVar90 = pfVar7[6];
          auVar135._0_4_ = auVar194._0_4_ * fVar222;
          auVar135._4_4_ = auVar194._4_4_ * fVar85;
          auVar135._8_4_ = auVar194._8_4_ * fVar86;
          auVar135._12_4_ = auVar194._12_4_ * fVar87;
          auVar135._16_4_ = auVar194._16_4_ * fVar88;
          auVar135._20_4_ = auVar194._20_4_ * fVar89;
          auVar135._28_36_ = auVar194._28_36_;
          auVar135._24_4_ = auVar194._24_4_ * fVar90;
          auVar56._4_4_ = auVar188._4_4_ * fVar85;
          auVar56._0_4_ = auVar188._0_4_ * fVar222;
          auVar56._8_4_ = auVar188._8_4_ * fVar86;
          auVar56._12_4_ = auVar188._12_4_ * fVar87;
          auVar56._16_4_ = auVar188._16_4_ * fVar88;
          auVar56._20_4_ = auVar188._20_4_ * fVar89;
          auVar56._24_4_ = auVar188._24_4_ * fVar90;
          auVar56._28_4_ = uStack_604;
          auVar10 = vfmadd231ps_fma(auVar135._0_32_,auVar149,auVar144);
          auVar156 = vfmadd231ps_fma(auVar56,auVar149,auVar166);
          auVar10 = vfmadd231ps_fma(ZEXT1632(auVar10),auVar20,auVar216);
          auVar156 = vfmadd231ps_fma(ZEXT1632(auVar156),auVar20,auVar115);
          auVar10 = vfmadd231ps_fma(ZEXT1632(auVar10),auVar124,auVar162);
          auVar156 = vfmadd231ps_fma(ZEXT1632(auVar156),auVar124,local_600);
          local_4a0 = ZEXT1632(auVar10);
          local_460 = ZEXT1632(auVar159);
          auVar22 = vsubps_avx(local_4a0,local_460);
          local_6c0 = ZEXT1632(auVar156);
          local_6a0 = ZEXT1632(auVar19);
          local_480 = vsubps_avx(local_6c0,local_6a0);
          auVar84._4_4_ = auVar22._4_4_ * auVar19._4_4_;
          auVar84._0_4_ = auVar22._0_4_ * auVar19._0_4_;
          auVar84._8_4_ = auVar22._8_4_ * auVar19._8_4_;
          auVar84._12_4_ = auVar22._12_4_ * auVar19._12_4_;
          auVar84._16_4_ = auVar22._16_4_ * 0.0;
          auVar84._20_4_ = auVar22._20_4_ * 0.0;
          auVar84._24_4_ = auVar22._24_4_ * 0.0;
          auVar84._28_4_ = local_600._28_4_;
          fVar137 = local_480._0_4_;
          auVar132._0_4_ = auVar159._0_4_ * fVar137;
          fVar136 = local_480._4_4_;
          auVar132._4_4_ = auVar159._4_4_ * fVar136;
          fVar173 = local_480._8_4_;
          auVar132._8_4_ = auVar159._8_4_ * fVar173;
          fVar174 = local_480._12_4_;
          auVar132._12_4_ = auVar159._12_4_ * fVar174;
          fVar175 = local_480._16_4_;
          auVar132._16_4_ = fVar175 * 0.0;
          fVar176 = local_480._20_4_;
          auVar132._20_4_ = fVar176 * 0.0;
          fVar177 = local_480._24_4_;
          auVar132._24_4_ = fVar177 * 0.0;
          auVar132._28_4_ = 0;
          auVar213 = ZEXT3264(auVar172);
          auVar168 = vsubps_avx(auVar84,auVar132);
          auVar194._0_4_ = (float)local_100 * fVar178;
          auVar194._4_4_ = local_100._4_4_ * fVar208;
          auVar194._8_4_ = (float)uStack_f8 * fVar214;
          auVar194._12_4_ = uStack_f8._4_4_ * fVar218;
          auVar194._16_4_ = (float)uStack_f0 * fVar219;
          auVar194._20_4_ = uStack_f0._4_4_ * fVar220;
          auVar194._28_36_ = auVar188._28_36_;
          auVar194._24_4_ = (float)uStack_e8 * fVar221;
          auVar159 = vfmadd231ps_fma(auVar194._0_32_,auVar172,local_e0);
          auVar159 = vfmadd231ps_fma(ZEXT1632(auVar159),auVar122,local_c0);
          auVar159 = vfmadd231ps_fma(ZEXT1632(auVar159),local_a0,auVar133);
          auVar57._4_4_ = local_100._4_4_ * fVar85;
          auVar57._0_4_ = (float)local_100 * fVar222;
          auVar57._8_4_ = (float)uStack_f8 * fVar86;
          auVar57._12_4_ = uStack_f8._4_4_ * fVar87;
          auVar57._16_4_ = (float)uStack_f0 * fVar88;
          auVar57._20_4_ = uStack_f0._4_4_ * fVar89;
          auVar57._24_4_ = (float)uStack_e8 * fVar90;
          auVar57._28_4_ = uStack_e8._4_4_;
          auVar19 = vfmadd231ps_fma(auVar57,auVar149,local_e0);
          auVar19 = vfmadd231ps_fma(ZEXT1632(auVar19),auVar20,local_c0);
          auVar19 = vfmadd231ps_fma(ZEXT1632(auVar19),auVar124,local_a0);
          auVar58._4_4_ = fVar136 * fVar136;
          auVar58._0_4_ = fVar137 * fVar137;
          auVar58._8_4_ = fVar173 * fVar173;
          auVar58._12_4_ = fVar174 * fVar174;
          auVar58._16_4_ = fVar175 * fVar175;
          auVar58._20_4_ = fVar176 * fVar176;
          auVar58._24_4_ = fVar177 * fVar177;
          auVar58._28_4_ = local_a0._28_4_;
          auVar10 = vfmadd231ps_fma(auVar58,auVar22,auVar22);
          auVar21 = vmaxps_avx(ZEXT1632(auVar159),ZEXT1632(auVar19));
          auVar197._0_4_ = auVar21._0_4_ * auVar21._0_4_ * auVar10._0_4_;
          auVar197._4_4_ = auVar21._4_4_ * auVar21._4_4_ * auVar10._4_4_;
          auVar197._8_4_ = auVar21._8_4_ * auVar21._8_4_ * auVar10._8_4_;
          auVar197._12_4_ = auVar21._12_4_ * auVar21._12_4_ * auVar10._12_4_;
          auVar197._16_4_ = auVar21._16_4_ * auVar21._16_4_ * 0.0;
          auVar197._20_4_ = auVar21._20_4_ * auVar21._20_4_ * 0.0;
          auVar197._24_4_ = auVar21._24_4_ * auVar21._24_4_ * 0.0;
          auVar197._28_4_ = 0;
          auVar59._4_4_ = auVar168._4_4_ * auVar168._4_4_;
          auVar59._0_4_ = auVar168._0_4_ * auVar168._0_4_;
          auVar59._8_4_ = auVar168._8_4_ * auVar168._8_4_;
          auVar59._12_4_ = auVar168._12_4_ * auVar168._12_4_;
          auVar59._16_4_ = auVar168._16_4_ * auVar168._16_4_;
          auVar59._20_4_ = auVar168._20_4_ * auVar168._20_4_;
          auVar59._24_4_ = auVar168._24_4_ * auVar168._24_4_;
          auVar59._28_4_ = auVar168._28_4_;
          auVar21 = vcmpps_avx(auVar59,auVar197,2);
          local_360 = (int)lVar106;
          auVar198._4_4_ = local_360;
          auVar198._0_4_ = local_360;
          auVar198._8_4_ = local_360;
          auVar198._12_4_ = local_360;
          auVar198._16_4_ = local_360;
          auVar198._20_4_ = local_360;
          auVar198._24_4_ = local_360;
          auVar198._28_4_ = local_360;
          auVar168 = vpor_avx2(auVar198,_DAT_01fe9900);
          auVar96._4_4_ = fStack_4bc;
          auVar96._0_4_ = local_4c0;
          auVar96._8_4_ = fStack_4b8;
          auVar96._12_4_ = fStack_4b4;
          auVar96._16_4_ = fStack_4b0;
          auVar96._20_4_ = fStack_4ac;
          auVar96._24_4_ = fStack_4a8;
          auVar96._28_4_ = iStack_4a4;
          auVar23 = vpcmpgtd_avx2(auVar96,auVar168);
          auVar168 = auVar23 & auVar21;
          if ((((((((auVar168 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar168 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar168 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar168 >> 0x7f,0) == '\0') &&
                (auVar168 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar168 >> 0xbf,0) == '\0') &&
              (auVar168 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar168[0x1f]) {
            auVar199 = ZEXT3264(auVar126);
            auVar203 = ZEXT3264(auVar115);
LAB_0183ffc0:
            auVar135 = ZEXT3264(local_720);
            auVar194 = ZEXT3264(CONCAT428(fVar207,CONCAT424(fVar207,CONCAT420(fVar207,CONCAT416(
                                                  fVar207,CONCAT412(fVar207,CONCAT48(fVar207,
                                                  CONCAT44(fVar207,fVar207))))))));
            auVar188 = ZEXT3264(CONCAT428(fVar226,CONCAT424(fVar223,CONCAT420(fVar226,CONCAT416(
                                                  fVar223,CONCAT412(fVar226,CONCAT48(fVar223,uVar109
                                                                                    )))))));
          }
          else {
            local_540 = vandps_avx(auVar23,auVar21);
            auVar60._4_4_ = (float)local_6e0._4_4_ * fVar85;
            auVar60._0_4_ = (float)local_6e0._0_4_ * fVar222;
            auVar60._8_4_ = fStack_6d8 * fVar86;
            auVar60._12_4_ = fStack_6d4 * fVar87;
            auVar60._16_4_ = fStack_6d0 * fVar88;
            auVar60._20_4_ = fStack_6cc * fVar89;
            auVar60._24_4_ = fStack_6c8 * fVar90;
            auVar60._28_4_ = auVar21._28_4_;
            auVar10 = vfmadd213ps_fma(auVar149,local_3e0,auVar60);
            auVar10 = vfmadd213ps_fma(auVar20,local_5a0,ZEXT1632(auVar10));
            auVar10 = vfmadd132ps_fma(auVar124,ZEXT1632(auVar10),local_5c0);
            local_5e0._0_4_ = auVar98._0_4_;
            local_5e0._4_4_ = auVar98._4_4_;
            fStack_5d8 = auVar98._8_4_;
            fStack_5d4 = auVar98._12_4_;
            fStack_5d0 = auVar98._16_4_;
            fStack_5cc = auVar98._20_4_;
            fStack_5c8 = auVar98._24_4_;
            auVar61._4_4_ = (float)local_6e0._4_4_ * (float)local_5e0._4_4_;
            auVar61._0_4_ = (float)local_6e0._0_4_ * (float)local_5e0._0_4_;
            auVar61._8_4_ = fStack_6d8 * fStack_5d8;
            auVar61._12_4_ = fStack_6d4 * fStack_5d4;
            auVar61._16_4_ = fStack_6d0 * fStack_5d0;
            auVar61._20_4_ = fStack_6cc * fStack_5cc;
            auVar61._24_4_ = fStack_6c8 * fStack_5c8;
            auVar61._28_4_ = auVar21._28_4_;
            auVar156 = vfmadd213ps_fma(auVar172,local_3e0,auVar61);
            auVar156 = vfmadd213ps_fma(auVar122,local_5a0,ZEXT1632(auVar156));
            auVar122 = *(undefined1 (*) [32])(lVar24 + 0x21afd38 + lVar106 * 4);
            auVar172 = *(undefined1 (*) [32])(lVar24 + 0x21b01bc + lVar106 * 4);
            auVar149 = *(undefined1 (*) [32])(lVar24 + 0x21b0640 + lVar106 * 4);
            pfVar7 = (float *)(lVar24 + 0x21b0ac4 + lVar106 * 4);
            fVar137 = *pfVar7;
            fVar136 = pfVar7[1];
            fVar173 = pfVar7[2];
            fVar174 = pfVar7[3];
            fVar175 = pfVar7[4];
            fVar176 = pfVar7[5];
            fVar177 = pfVar7[6];
            auVar62._4_4_ = fVar207 * fVar136;
            auVar62._0_4_ = fVar207 * fVar137;
            auVar62._8_4_ = fVar207 * fVar173;
            auVar62._12_4_ = fVar207 * fVar174;
            auVar62._16_4_ = fVar207 * fVar175;
            auVar62._20_4_ = fVar207 * fVar176;
            auVar62._24_4_ = fVar207 * fVar177;
            auVar62._28_4_ = auVar22._28_4_;
            auVar210._0_4_ = fVar223 * fVar137;
            auVar210._4_4_ = fVar226 * fVar136;
            auVar210._8_4_ = fVar223 * fVar173;
            auVar210._12_4_ = fVar226 * fVar174;
            auVar210._16_4_ = fVar223 * fVar175;
            auVar210._20_4_ = fVar226 * fVar176;
            auVar210._24_4_ = fVar223 * fVar177;
            auVar210._28_4_ = 0;
            auVar63._4_4_ = fVar136 * (float)local_6e0._4_4_;
            auVar63._0_4_ = fVar137 * (float)local_6e0._0_4_;
            auVar63._8_4_ = fVar173 * fStack_6d8;
            auVar63._12_4_ = fVar174 * fStack_6d4;
            auVar63._16_4_ = fVar175 * fStack_6d0;
            auVar63._20_4_ = fVar176 * fStack_6cc;
            auVar63._24_4_ = fVar177 * fStack_6c8;
            auVar63._28_4_ = pfVar7[7];
            auVar14 = vfmadd231ps_fma(auVar62,auVar149,auVar144);
            auVar15 = vfmadd231ps_fma(auVar210,auVar149,auVar166);
            auVar110 = vfmadd231ps_fma(auVar63,local_3e0,auVar149);
            auVar14 = vfmadd231ps_fma(ZEXT1632(auVar14),auVar172,auVar216);
            auVar15 = vfmadd231ps_fma(ZEXT1632(auVar15),auVar172,auVar152);
            auVar110 = vfmadd231ps_fma(ZEXT1632(auVar110),local_5a0,auVar172);
            auVar14 = vfmadd231ps_fma(ZEXT1632(auVar14),auVar122,auVar162);
            auVar15 = vfmadd231ps_fma(ZEXT1632(auVar15),auVar122,local_600);
            auVar110 = vfmadd231ps_fma(ZEXT1632(auVar110),local_5c0,auVar122);
            pfVar7 = (float *)(lVar24 + 0x21b2ee4 + lVar106 * 4);
            fVar137 = *pfVar7;
            fVar136 = pfVar7[1];
            fVar173 = pfVar7[2];
            fVar174 = pfVar7[3];
            fVar175 = pfVar7[4];
            fVar176 = pfVar7[5];
            fVar177 = pfVar7[6];
            auVar64._4_4_ = fVar207 * fVar136;
            auVar64._0_4_ = fVar207 * fVar137;
            auVar64._8_4_ = fVar207 * fVar173;
            auVar64._12_4_ = fVar207 * fVar174;
            auVar64._16_4_ = fVar207 * fVar175;
            auVar64._20_4_ = fVar207 * fVar176;
            auVar64._24_4_ = fVar207 * fVar177;
            auVar64._28_4_ = fVar207;
            auVar65._4_4_ = fVar226 * fVar136;
            auVar65._0_4_ = fVar223 * fVar137;
            auVar65._8_4_ = fVar223 * fVar173;
            auVar65._12_4_ = fVar226 * fVar174;
            auVar65._16_4_ = fVar223 * fVar175;
            auVar65._20_4_ = fVar226 * fVar176;
            auVar65._24_4_ = fVar223 * fVar177;
            auVar65._28_4_ = fVar226;
            auVar66._4_4_ = (float)local_6e0._4_4_ * fVar136;
            auVar66._0_4_ = (float)local_6e0._0_4_ * fVar137;
            auVar66._8_4_ = fStack_6d8 * fVar173;
            auVar66._12_4_ = fStack_6d4 * fVar174;
            auVar66._16_4_ = fStack_6d0 * fVar175;
            auVar66._20_4_ = fStack_6cc * fVar176;
            auVar66._24_4_ = fStack_6c8 * fVar177;
            auVar66._28_4_ = pfVar7[7];
            auVar122 = *(undefined1 (*) [32])(lVar24 + 0x21b2a60 + lVar106 * 4);
            auVar190 = vfmadd231ps_fma(auVar64,auVar122,auVar144);
            auVar155 = vfmadd231ps_fma(auVar65,auVar122,auVar166);
            auVar179 = vfmadd231ps_fma(auVar66,local_3e0,auVar122);
            auVar122 = *(undefined1 (*) [32])(lVar24 + 0x21b25dc + lVar106 * 4);
            auVar190 = vfmadd231ps_fma(ZEXT1632(auVar190),auVar122,auVar216);
            auVar155 = vfmadd231ps_fma(ZEXT1632(auVar155),auVar122,auVar152);
            auVar179 = vfmadd231ps_fma(ZEXT1632(auVar179),local_5a0,auVar122);
            auVar122 = *(undefined1 (*) [32])(lVar24 + 0x21b2158 + lVar106 * 4);
            auVar190 = vfmadd231ps_fma(ZEXT1632(auVar190),auVar122,auVar162);
            auVar155 = vfmadd231ps_fma(ZEXT1632(auVar155),auVar122,local_600);
            auVar179 = vfmadd231ps_fma(ZEXT1632(auVar179),local_5c0,auVar122);
            auVar122 = vandps_avx(ZEXT1632(auVar14),local_400);
            auVar172 = vandps_avx(ZEXT1632(auVar15),local_400);
            auVar172 = vmaxps_avx(auVar122,auVar172);
            auVar122 = vandps_avx(ZEXT1632(auVar110),local_400);
            auVar122 = vmaxps_avx(auVar172,auVar122);
            auVar122 = vcmpps_avx(auVar122,_local_4e0,1);
            auVar149 = vblendvps_avx(ZEXT1632(auVar14),auVar22,auVar122);
            auVar21 = vblendvps_avx(ZEXT1632(auVar15),local_480,auVar122);
            auVar122 = vandps_avx(ZEXT1632(auVar190),local_400);
            auVar172 = vandps_avx(ZEXT1632(auVar155),local_400);
            auVar172 = vmaxps_avx(auVar122,auVar172);
            auVar122 = vandps_avx(local_400,ZEXT1632(auVar179));
            auVar122 = vmaxps_avx(auVar172,auVar122);
            auVar172 = vcmpps_avx(auVar122,_local_4e0,1);
            auVar122 = vblendvps_avx(ZEXT1632(auVar190),auVar22,auVar172);
            auVar172 = vblendvps_avx(ZEXT1632(auVar155),local_480,auVar172);
            auVar156 = vfmadd213ps_fma(auVar133,local_5c0,ZEXT1632(auVar156));
            auVar14 = vfmadd213ps_fma(auVar149,auVar149,ZEXT832(0) << 0x20);
            auVar14 = vfmadd231ps_fma(ZEXT1632(auVar14),auVar21,auVar21);
            auVar133 = vrsqrtps_avx(ZEXT1632(auVar14));
            fVar137 = auVar133._0_4_;
            fVar136 = auVar133._4_4_;
            fVar173 = auVar133._8_4_;
            fVar174 = auVar133._12_4_;
            fVar175 = auVar133._16_4_;
            fVar176 = auVar133._20_4_;
            fVar177 = auVar133._24_4_;
            auVar67._4_4_ = fVar136 * fVar136 * fVar136 * auVar14._4_4_ * -0.5;
            auVar67._0_4_ = fVar137 * fVar137 * fVar137 * auVar14._0_4_ * -0.5;
            auVar67._8_4_ = fVar173 * fVar173 * fVar173 * auVar14._8_4_ * -0.5;
            auVar67._12_4_ = fVar174 * fVar174 * fVar174 * auVar14._12_4_ * -0.5;
            auVar67._16_4_ = fVar175 * fVar175 * fVar175 * -0.0;
            auVar67._20_4_ = fVar176 * fVar176 * fVar176 * -0.0;
            auVar67._24_4_ = fVar177 * fVar177 * fVar177 * -0.0;
            auVar67._28_4_ = 0;
            auVar164._8_4_ = 0x3fc00000;
            auVar164._0_8_ = 0x3fc000003fc00000;
            auVar164._12_4_ = 0x3fc00000;
            auVar164._16_4_ = 0x3fc00000;
            auVar164._20_4_ = 0x3fc00000;
            auVar164._24_4_ = 0x3fc00000;
            auVar164._28_4_ = 0x3fc00000;
            auVar14 = vfmadd231ps_fma(auVar67,auVar164,auVar133);
            fVar137 = auVar14._0_4_;
            fVar136 = auVar14._4_4_;
            auVar68._4_4_ = auVar21._4_4_ * fVar136;
            auVar68._0_4_ = auVar21._0_4_ * fVar137;
            fVar173 = auVar14._8_4_;
            auVar68._8_4_ = auVar21._8_4_ * fVar173;
            fVar174 = auVar14._12_4_;
            auVar68._12_4_ = auVar21._12_4_ * fVar174;
            auVar68._16_4_ = auVar21._16_4_ * 0.0;
            auVar68._20_4_ = auVar21._20_4_ * 0.0;
            auVar68._24_4_ = auVar21._24_4_ * 0.0;
            auVar68._28_4_ = auVar21._28_4_;
            auVar69._4_4_ = fVar136 * -auVar149._4_4_;
            auVar69._0_4_ = fVar137 * -auVar149._0_4_;
            auVar69._8_4_ = fVar173 * -auVar149._8_4_;
            auVar69._12_4_ = fVar174 * -auVar149._12_4_;
            auVar69._16_4_ = -auVar149._16_4_ * 0.0;
            auVar69._20_4_ = -auVar149._20_4_ * 0.0;
            auVar69._24_4_ = -auVar149._24_4_ * 0.0;
            auVar69._28_4_ = auVar133._28_4_;
            auVar14 = vfmadd213ps_fma(auVar122,auVar122,ZEXT832(0) << 0x20);
            auVar14 = vfmadd231ps_fma(ZEXT1632(auVar14),auVar172,auVar172);
            auVar133 = vrsqrtps_avx(ZEXT1632(auVar14));
            auVar70._28_4_ = auVar22._28_4_;
            auVar70._0_28_ =
                 ZEXT1628(CONCAT412(fVar174 * 0.0,
                                    CONCAT48(fVar173 * 0.0,CONCAT44(fVar136 * 0.0,fVar137 * 0.0))));
            fVar137 = auVar133._0_4_;
            fVar136 = auVar133._4_4_;
            fVar173 = auVar133._8_4_;
            fVar174 = auVar133._12_4_;
            fVar175 = auVar133._16_4_;
            fVar176 = auVar133._20_4_;
            fVar177 = auVar133._24_4_;
            auVar71._4_4_ = fVar136 * fVar136 * fVar136 * auVar14._4_4_ * -0.5;
            auVar71._0_4_ = fVar137 * fVar137 * fVar137 * auVar14._0_4_ * -0.5;
            auVar71._8_4_ = fVar173 * fVar173 * fVar173 * auVar14._8_4_ * -0.5;
            auVar71._12_4_ = fVar174 * fVar174 * fVar174 * auVar14._12_4_ * -0.5;
            auVar71._16_4_ = fVar175 * fVar175 * fVar175 * -0.0;
            auVar71._20_4_ = fVar176 * fVar176 * fVar176 * -0.0;
            auVar71._24_4_ = fVar177 * fVar177 * fVar177 * -0.0;
            auVar71._28_4_ = 0;
            auVar14 = vfmadd231ps_fma(auVar71,auVar164,auVar133);
            fVar137 = auVar14._0_4_;
            fVar136 = auVar14._4_4_;
            auVar72._4_4_ = auVar172._4_4_ * fVar136;
            auVar72._0_4_ = auVar172._0_4_ * fVar137;
            fVar173 = auVar14._8_4_;
            auVar72._8_4_ = auVar172._8_4_ * fVar173;
            fVar174 = auVar14._12_4_;
            auVar72._12_4_ = auVar172._12_4_ * fVar174;
            auVar72._16_4_ = auVar172._16_4_ * 0.0;
            auVar72._20_4_ = auVar172._20_4_ * 0.0;
            auVar72._24_4_ = auVar172._24_4_ * 0.0;
            auVar72._28_4_ = 0;
            auVar73._4_4_ = fVar136 * -auVar122._4_4_;
            auVar73._0_4_ = fVar137 * -auVar122._0_4_;
            auVar73._8_4_ = fVar173 * -auVar122._8_4_;
            auVar73._12_4_ = fVar174 * -auVar122._12_4_;
            auVar73._16_4_ = -auVar122._16_4_ * 0.0;
            auVar73._20_4_ = -auVar122._20_4_ * 0.0;
            auVar73._24_4_ = -auVar122._24_4_ * 0.0;
            auVar73._28_4_ = 0;
            auVar74._28_4_ = 0xbf000000;
            auVar74._0_28_ =
                 ZEXT1628(CONCAT412(fVar174 * 0.0,
                                    CONCAT48(fVar173 * 0.0,CONCAT44(fVar136 * 0.0,fVar137 * 0.0))));
            auVar14 = vfmadd213ps_fma(auVar68,ZEXT1632(auVar159),local_460);
            auVar133 = ZEXT1632(auVar159);
            auVar15 = vfmadd213ps_fma(auVar69,auVar133,local_6a0);
            auVar110 = vfmadd213ps_fma(auVar70,auVar133,ZEXT1632(auVar156));
            auVar180 = vfnmadd213ps_fma(auVar68,auVar133,local_460);
            auVar190 = vfmadd213ps_fma(auVar72,ZEXT1632(auVar19),local_4a0);
            auVar191 = vfnmadd213ps_fma(auVar69,auVar133,local_6a0);
            auVar133 = ZEXT1632(auVar19);
            auVar155 = vfmadd213ps_fma(auVar73,auVar133,local_6c0);
            auVar185 = ZEXT1632(auVar159);
            auVar28 = vfnmadd231ps_fma(ZEXT1632(auVar156),auVar185,auVar70);
            auVar156 = vfmadd213ps_fma(auVar74,auVar133,ZEXT1632(auVar10));
            auVar26 = vfnmadd213ps_fma(auVar72,auVar133,local_4a0);
            auVar27 = vfnmadd213ps_fma(auVar73,auVar133,local_6c0);
            auVar192 = vfnmadd231ps_fma(ZEXT1632(auVar10),ZEXT1632(auVar19),auVar74);
            auVar133 = vsubps_avx(ZEXT1632(auVar155),ZEXT1632(auVar191));
            auVar122 = vsubps_avx(ZEXT1632(auVar156),ZEXT1632(auVar28));
            auVar186._0_4_ = auVar133._0_4_ * auVar28._0_4_;
            auVar186._4_4_ = auVar133._4_4_ * auVar28._4_4_;
            auVar186._8_4_ = auVar133._8_4_ * auVar28._8_4_;
            auVar186._12_4_ = auVar133._12_4_ * auVar28._12_4_;
            auVar186._16_4_ = auVar133._16_4_ * 0.0;
            auVar186._20_4_ = auVar133._20_4_ * 0.0;
            auVar186._24_4_ = auVar133._24_4_ * 0.0;
            auVar186._28_4_ = 0;
            auVar179 = vfmsub231ps_fma(auVar186,ZEXT1632(auVar191),auVar122);
            auVar75._4_4_ = auVar180._4_4_ * auVar122._4_4_;
            auVar75._0_4_ = auVar180._0_4_ * auVar122._0_4_;
            auVar75._8_4_ = auVar180._8_4_ * auVar122._8_4_;
            auVar75._12_4_ = auVar180._12_4_ * auVar122._12_4_;
            auVar75._16_4_ = auVar122._16_4_ * 0.0;
            auVar75._20_4_ = auVar122._20_4_ * 0.0;
            auVar75._24_4_ = auVar122._24_4_ * 0.0;
            auVar75._28_4_ = auVar122._28_4_;
            auVar168 = ZEXT1632(auVar180);
            auVar122 = vsubps_avx(ZEXT1632(auVar190),auVar168);
            auVar124 = ZEXT1632(auVar28);
            auVar10 = vfmsub231ps_fma(auVar75,auVar124,auVar122);
            auVar76._4_4_ = auVar191._4_4_ * auVar122._4_4_;
            auVar76._0_4_ = auVar191._0_4_ * auVar122._0_4_;
            auVar76._8_4_ = auVar191._8_4_ * auVar122._8_4_;
            auVar76._12_4_ = auVar191._12_4_ * auVar122._12_4_;
            auVar76._16_4_ = auVar122._16_4_ * 0.0;
            auVar76._20_4_ = auVar122._20_4_ * 0.0;
            auVar76._24_4_ = auVar122._24_4_ * 0.0;
            auVar76._28_4_ = auVar122._28_4_;
            auVar180 = vfmsub231ps_fma(auVar76,auVar168,auVar133);
            auVar10 = vfmadd231ps_fma(ZEXT1632(auVar180),ZEXT832(0) << 0x20,ZEXT1632(auVar10));
            auVar10 = vfmadd231ps_fma(ZEXT1632(auVar10),ZEXT832(0) << 0x20,ZEXT1632(auVar179));
            auVar20 = vcmpps_avx(ZEXT1632(auVar10),ZEXT832(0) << 0x20,2);
            auVar133 = vblendvps_avx(ZEXT1632(auVar26),ZEXT1632(auVar14),auVar20);
            auVar122 = vblendvps_avx(ZEXT1632(auVar27),ZEXT1632(auVar15),auVar20);
            auVar172 = vblendvps_avx(ZEXT1632(auVar192),ZEXT1632(auVar110),auVar20);
            auVar149 = vblendvps_avx(auVar168,ZEXT1632(auVar190),auVar20);
            auVar21 = vblendvps_avx(ZEXT1632(auVar191),ZEXT1632(auVar155),auVar20);
            auVar22 = vblendvps_avx(auVar124,ZEXT1632(auVar156),auVar20);
            auVar168 = vblendvps_avx(ZEXT1632(auVar190),auVar168,auVar20);
            auVar23 = vblendvps_avx(ZEXT1632(auVar155),ZEXT1632(auVar191),auVar20);
            auVar10 = vpackssdw_avx(local_540._0_16_,local_540._16_16_);
            auVar124 = vblendvps_avx(ZEXT1632(auVar156),auVar124,auVar20);
            auVar168 = vsubps_avx(auVar168,auVar133);
            auVar23 = vsubps_avx(auVar23,auVar122);
            auVar115 = vsubps_avx(auVar124,auVar172);
            auVar213 = ZEXT3264(auVar115);
            auVar143 = vsubps_avx(auVar133,auVar149);
            auVar165 = vsubps_avx(auVar122,auVar21);
            auVar193 = vsubps_avx(auVar172,auVar22);
            auVar169._0_4_ = auVar115._0_4_ * auVar133._0_4_;
            auVar169._4_4_ = auVar115._4_4_ * auVar133._4_4_;
            auVar169._8_4_ = auVar115._8_4_ * auVar133._8_4_;
            auVar169._12_4_ = auVar115._12_4_ * auVar133._12_4_;
            auVar169._16_4_ = auVar115._16_4_ * auVar133._16_4_;
            auVar169._20_4_ = auVar115._20_4_ * auVar133._20_4_;
            auVar169._24_4_ = auVar115._24_4_ * auVar133._24_4_;
            auVar169._28_4_ = 0;
            auVar156 = vfmsub231ps_fma(auVar169,auVar172,auVar168);
            auVar77._4_4_ = auVar168._4_4_ * auVar122._4_4_;
            auVar77._0_4_ = auVar168._0_4_ * auVar122._0_4_;
            auVar77._8_4_ = auVar168._8_4_ * auVar122._8_4_;
            auVar77._12_4_ = auVar168._12_4_ * auVar122._12_4_;
            auVar77._16_4_ = auVar168._16_4_ * auVar122._16_4_;
            auVar77._20_4_ = auVar168._20_4_ * auVar122._20_4_;
            auVar77._24_4_ = auVar168._24_4_ * auVar122._24_4_;
            auVar77._28_4_ = auVar124._28_4_;
            auVar14 = vfmsub231ps_fma(auVar77,auVar133,auVar23);
            auVar156 = vfmadd231ps_fma(ZEXT1632(auVar14),ZEXT1632(auVar156),_DAT_01faff00);
            auVar170._0_4_ = auVar23._0_4_ * auVar172._0_4_;
            auVar170._4_4_ = auVar23._4_4_ * auVar172._4_4_;
            auVar170._8_4_ = auVar23._8_4_ * auVar172._8_4_;
            auVar170._12_4_ = auVar23._12_4_ * auVar172._12_4_;
            auVar170._16_4_ = auVar23._16_4_ * auVar172._16_4_;
            auVar170._20_4_ = auVar23._20_4_ * auVar172._20_4_;
            auVar170._24_4_ = auVar23._24_4_ * auVar172._24_4_;
            auVar170._28_4_ = 0;
            auVar14 = vfmsub231ps_fma(auVar170,auVar122,auVar115);
            auVar14 = vfmadd231ps_fma(ZEXT1632(auVar156),ZEXT832(0) << 0x20,ZEXT1632(auVar14));
            auVar171._0_4_ = auVar193._0_4_ * auVar149._0_4_;
            auVar171._4_4_ = auVar193._4_4_ * auVar149._4_4_;
            auVar171._8_4_ = auVar193._8_4_ * auVar149._8_4_;
            auVar171._12_4_ = auVar193._12_4_ * auVar149._12_4_;
            auVar171._16_4_ = auVar193._16_4_ * auVar149._16_4_;
            auVar171._20_4_ = auVar193._20_4_ * auVar149._20_4_;
            auVar171._24_4_ = auVar193._24_4_ * auVar149._24_4_;
            auVar171._28_4_ = 0;
            auVar156 = vfmsub231ps_fma(auVar171,auVar143,auVar22);
            auVar78._4_4_ = auVar165._4_4_ * auVar22._4_4_;
            auVar78._0_4_ = auVar165._0_4_ * auVar22._0_4_;
            auVar78._8_4_ = auVar165._8_4_ * auVar22._8_4_;
            auVar78._12_4_ = auVar165._12_4_ * auVar22._12_4_;
            auVar78._16_4_ = auVar165._16_4_ * auVar22._16_4_;
            auVar78._20_4_ = auVar165._20_4_ * auVar22._20_4_;
            auVar78._24_4_ = auVar165._24_4_ * auVar22._24_4_;
            auVar78._28_4_ = auVar22._28_4_;
            auVar15 = vfmsub231ps_fma(auVar78,auVar21,auVar193);
            auVar79._4_4_ = auVar143._4_4_ * auVar21._4_4_;
            auVar79._0_4_ = auVar143._0_4_ * auVar21._0_4_;
            auVar79._8_4_ = auVar143._8_4_ * auVar21._8_4_;
            auVar79._12_4_ = auVar143._12_4_ * auVar21._12_4_;
            auVar79._16_4_ = auVar143._16_4_ * auVar21._16_4_;
            auVar79._20_4_ = auVar143._20_4_ * auVar21._20_4_;
            auVar79._24_4_ = auVar143._24_4_ * auVar21._24_4_;
            auVar79._28_4_ = auVar21._28_4_;
            auVar110 = vfmsub231ps_fma(auVar79,auVar165,auVar149);
            auVar156 = vfmadd231ps_fma(ZEXT1632(auVar110),ZEXT832(0) << 0x20,ZEXT1632(auVar156));
            auVar15 = vfmadd231ps_fma(ZEXT1632(auVar156),ZEXT832(0) << 0x20,ZEXT1632(auVar15));
            auVar149 = vmaxps_avx(ZEXT1632(auVar14),ZEXT1632(auVar15));
            auVar149 = vcmpps_avx(auVar149,ZEXT832(0) << 0x20,2);
            auVar156 = vpackssdw_avx(auVar149._0_16_,auVar149._16_16_);
            auVar156 = vpand_avx(auVar156,auVar10);
            auVar149 = vpmovsxwd_avx2(auVar156);
            if ((((((((auVar149 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar149 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar149 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar149 >> 0x7f,0) == '\0') &&
                  (auVar149 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(auVar149 >> 0xbf,0) == '\0') &&
                (auVar149 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar149[0x1f]) {
LAB_018404f3:
              auVar188 = ZEXT3264(CONCAT824(uStack_628,
                                            CONCAT816(uStack_630,CONCAT88(uStack_638,local_640))));
              auVar199 = ZEXT3264(auVar126);
            }
            else {
              auVar80._4_4_ = auVar23._4_4_ * auVar193._4_4_;
              auVar80._0_4_ = auVar23._0_4_ * auVar193._0_4_;
              auVar80._8_4_ = auVar23._8_4_ * auVar193._8_4_;
              auVar80._12_4_ = auVar23._12_4_ * auVar193._12_4_;
              auVar80._16_4_ = auVar23._16_4_ * auVar193._16_4_;
              auVar80._20_4_ = auVar23._20_4_ * auVar193._20_4_;
              auVar80._24_4_ = auVar23._24_4_ * auVar193._24_4_;
              auVar80._28_4_ = auVar149._28_4_;
              auVar179 = vfmsub231ps_fma(auVar80,auVar165,auVar115);
              auVar187._0_4_ = auVar115._0_4_ * auVar143._0_4_;
              auVar187._4_4_ = auVar115._4_4_ * auVar143._4_4_;
              auVar187._8_4_ = auVar115._8_4_ * auVar143._8_4_;
              auVar187._12_4_ = auVar115._12_4_ * auVar143._12_4_;
              auVar187._16_4_ = auVar115._16_4_ * auVar143._16_4_;
              auVar187._20_4_ = auVar115._20_4_ * auVar143._20_4_;
              auVar187._24_4_ = auVar115._24_4_ * auVar143._24_4_;
              auVar187._28_4_ = 0;
              auVar155 = vfmsub231ps_fma(auVar187,auVar168,auVar193);
              auVar81._4_4_ = auVar168._4_4_ * auVar165._4_4_;
              auVar81._0_4_ = auVar168._0_4_ * auVar165._0_4_;
              auVar81._8_4_ = auVar168._8_4_ * auVar165._8_4_;
              auVar81._12_4_ = auVar168._12_4_ * auVar165._12_4_;
              auVar81._16_4_ = auVar168._16_4_ * auVar165._16_4_;
              auVar81._20_4_ = auVar168._20_4_ * auVar165._20_4_;
              auVar81._24_4_ = auVar168._24_4_ * auVar165._24_4_;
              auVar81._28_4_ = auVar165._28_4_;
              auVar180 = vfmsub231ps_fma(auVar81,auVar143,auVar23);
              auVar110 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar155),ZEXT1632(auVar180));
              auVar190 = vfmadd231ps_fma(ZEXT1632(auVar110),ZEXT1632(auVar179),ZEXT832(0) << 0x20);
              auVar149 = vrcpps_avx(ZEXT1632(auVar190));
              auVar211._8_4_ = 0x3f800000;
              auVar211._0_8_ = 0x3f8000003f800000;
              auVar211._12_4_ = 0x3f800000;
              auVar211._16_4_ = 0x3f800000;
              auVar211._20_4_ = 0x3f800000;
              auVar211._24_4_ = 0x3f800000;
              auVar211._28_4_ = 0x3f800000;
              auVar213 = ZEXT3264(auVar211);
              auVar110 = vfnmadd213ps_fma(auVar149,ZEXT1632(auVar190),auVar211);
              auVar110 = vfmadd132ps_fma(ZEXT1632(auVar110),auVar149,auVar149);
              auVar153._0_4_ = auVar180._0_4_ * auVar172._0_4_;
              auVar153._4_4_ = auVar180._4_4_ * auVar172._4_4_;
              auVar153._8_4_ = auVar180._8_4_ * auVar172._8_4_;
              auVar153._12_4_ = auVar180._12_4_ * auVar172._12_4_;
              auVar153._16_4_ = auVar172._16_4_ * 0.0;
              auVar153._20_4_ = auVar172._20_4_ * 0.0;
              auVar153._24_4_ = auVar172._24_4_ * 0.0;
              auVar153._28_4_ = 0;
              auVar155 = vfmadd231ps_fma(auVar153,ZEXT1632(auVar155),auVar122);
              auVar155 = vfmadd231ps_fma(ZEXT1632(auVar155),auVar133,ZEXT1632(auVar179));
              fVar137 = auVar110._0_4_;
              fVar136 = auVar110._4_4_;
              fVar173 = auVar110._8_4_;
              fVar174 = auVar110._12_4_;
              auVar172 = ZEXT1632(CONCAT412(fVar174 * auVar155._12_4_,
                                            CONCAT48(fVar173 * auVar155._8_4_,
                                                     CONCAT44(fVar136 * auVar155._4_4_,
                                                              fVar137 * auVar155._0_4_))));
              uVar108 = *(undefined4 *)(ray + k * 4 + 0x100);
              auVar154._4_4_ = uVar108;
              auVar154._0_4_ = uVar108;
              auVar154._8_4_ = uVar108;
              auVar154._12_4_ = uVar108;
              auVar154._16_4_ = uVar108;
              auVar154._20_4_ = uVar108;
              auVar154._24_4_ = uVar108;
              auVar154._28_4_ = uVar108;
              auVar97._4_4_ = uStack_11c;
              auVar97._0_4_ = local_120;
              auVar97._8_4_ = uStack_118;
              auVar97._12_4_ = uStack_114;
              auVar97._16_4_ = uStack_110;
              auVar97._20_4_ = uStack_10c;
              auVar97._24_4_ = uStack_108;
              auVar97._28_4_ = uStack_104;
              auVar133 = vcmpps_avx(auVar97,auVar172,2);
              auVar122 = vcmpps_avx(auVar172,auVar154,2);
              auVar133 = vandps_avx(auVar122,auVar133);
              auVar110 = vpackssdw_avx(auVar133._0_16_,auVar133._16_16_);
              auVar156 = vpand_avx(auVar156,auVar110);
              auVar133 = vpmovsxwd_avx2(auVar156);
              if ((((((((auVar133 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                       (auVar133 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                      (auVar133 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                     SUB321(auVar133 >> 0x7f,0) == '\0') &&
                    (auVar133 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                   SUB321(auVar133 >> 0xbf,0) == '\0') &&
                  (auVar133 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                  -1 < auVar133[0x1f]) goto LAB_018404f3;
              auVar133 = vcmpps_avx(ZEXT1632(auVar190),ZEXT832(0) << 0x20,4);
              auVar110 = vpackssdw_avx(auVar133._0_16_,auVar133._16_16_);
              auVar156 = vpand_avx(auVar156,auVar110);
              auVar133 = vpmovsxwd_avx2(auVar156);
              auVar188 = ZEXT3264(CONCAT824(uStack_628,
                                            CONCAT816(uStack_630,CONCAT88(uStack_638,local_640))));
              auVar199 = ZEXT3264(auVar126);
              if ((((((((auVar133 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar133 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar133 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar133 >> 0x7f,0) != '\0') ||
                    (auVar133 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar133 >> 0xbf,0) != '\0') ||
                  (auVar133 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar133[0x1f] < '\0') {
                auVar149 = ZEXT1632(CONCAT412(fVar174 * auVar14._12_4_,
                                              CONCAT48(fVar173 * auVar14._8_4_,
                                                       CONCAT44(fVar136 * auVar14._4_4_,
                                                                fVar137 * auVar14._0_4_))));
                auVar82._28_4_ = SUB84(uStack_628,4);
                auVar82._0_28_ =
                     ZEXT1628(CONCAT412(fVar174 * auVar15._12_4_,
                                        CONCAT48(fVar173 * auVar15._8_4_,
                                                 CONCAT44(fVar136 * auVar15._4_4_,
                                                          fVar137 * auVar15._0_4_))));
                auVar195._8_4_ = 0x3f800000;
                auVar195._0_8_ = 0x3f8000003f800000;
                auVar195._12_4_ = 0x3f800000;
                auVar195._16_4_ = 0x3f800000;
                auVar195._20_4_ = 0x3f800000;
                auVar195._24_4_ = 0x3f800000;
                auVar195._28_4_ = 0x3f800000;
                auVar122 = vsubps_avx(auVar195,auVar149);
                local_720 = vblendvps_avx(auVar122,auVar149,auVar20);
                auVar122 = vsubps_avx(auVar195,auVar82);
                local_520 = vblendvps_avx(auVar122,auVar82,auVar20);
                auVar188 = ZEXT3264(auVar133);
                auVar199 = ZEXT3264(auVar172);
              }
            }
            auVar206 = ZEXT3264(auVar113);
            auVar203 = ZEXT3264(auVar152);
            auVar133 = auVar188._0_32_;
            if ((((((((auVar133 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar133 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar133 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar133 >> 0x7f,0) == '\0') &&
                  (auVar188 & (undefined1  [64])0x100000000) == (undefined1  [64])0x0) &&
                 SUB321(auVar133 >> 0xbf,0) == '\0') &&
                (auVar188 & (undefined1  [64])0x100000000) == (undefined1  [64])0x0) &&
                -1 < auVar188[0x1f]) goto LAB_0183ffc0;
            auVar122 = vsubps_avx(ZEXT1632(auVar19),auVar185);
            auVar19 = vfmadd213ps_fma(auVar122,local_720,auVar185);
            fVar137 = *(float *)((long)pre->ray_space + k * 4 + -0x20);
            auVar83._4_4_ = (auVar19._4_4_ + auVar19._4_4_) * fVar137;
            auVar83._0_4_ = (auVar19._0_4_ + auVar19._0_4_) * fVar137;
            auVar83._8_4_ = (auVar19._8_4_ + auVar19._8_4_) * fVar137;
            auVar83._12_4_ = (auVar19._12_4_ + auVar19._12_4_) * fVar137;
            auVar83._16_4_ = fVar137 * 0.0;
            auVar83._20_4_ = fVar137 * 0.0;
            auVar83._24_4_ = fVar137 * 0.0;
            auVar83._28_4_ = fVar137;
            local_740 = auVar199._0_32_;
            auVar122 = vcmpps_avx(local_740,auVar83,6);
            auVar172 = auVar133 & auVar122;
            auVar194 = ZEXT3264(CONCAT428(fVar207,CONCAT424(fVar207,CONCAT420(fVar207,CONCAT416(
                                                  fVar207,CONCAT412(fVar207,CONCAT48(fVar207,
                                                  CONCAT44(fVar207,fVar207))))))));
            auVar188 = ZEXT3264(CONCAT428(fVar226,CONCAT424(fVar223,CONCAT420(fVar226,CONCAT416(
                                                  fVar223,CONCAT412(fVar226,CONCAT48(fVar223,uVar109
                                                                                    )))))));
            if ((((((((auVar172 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar172 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar172 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar172 >> 0x7f,0) == '\0') &&
                  (auVar172 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(auVar172 >> 0xbf,0) == '\0') &&
                (auVar172 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar172[0x1f]) {
              auVar135 = ZEXT3264(local_720);
            }
            else {
              auVar134._8_4_ = 0xbf800000;
              auVar134._0_8_ = 0xbf800000bf800000;
              auVar134._12_4_ = 0xbf800000;
              auVar134._16_4_ = 0xbf800000;
              auVar134._20_4_ = 0xbf800000;
              auVar134._24_4_ = 0xbf800000;
              auVar134._28_4_ = 0xbf800000;
              auVar150._8_4_ = 0x40000000;
              auVar150._0_8_ = 0x4000000040000000;
              auVar150._12_4_ = 0x40000000;
              auVar150._16_4_ = 0x40000000;
              auVar150._20_4_ = 0x40000000;
              auVar150._24_4_ = 0x40000000;
              auVar150._28_4_ = 0x40000000;
              auVar19 = vfmadd213ps_fma(local_520,auVar150,auVar134);
              local_3c0 = local_720;
              local_3a0 = ZEXT1632(auVar19);
              pGVar17 = (context->scene->geometries).items[(uint)local_920._4_4_].ptr;
              auVar135 = ZEXT3264(local_720);
              local_520 = local_3a0;
              if ((pGVar17->mask & *(uint *)(ray + k * 4 + 0x120)) == 0) {
                bVar99 = 0;
              }
              else if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                      (bVar99 = 1, pGVar17->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                auVar133 = vandps_avx(auVar122,auVar133);
                fVar137 = (float)local_360;
                local_2e0[0] = (fVar137 + local_720._0_4_ + 0.0) * local_160;
                local_2e0[1] = (fVar137 + local_720._4_4_ + 1.0) * fStack_15c;
                local_2e0[2] = (fVar137 + local_720._8_4_ + 2.0) * fStack_158;
                local_2e0[3] = (fVar137 + local_720._12_4_ + 3.0) * fStack_154;
                fStack_2d0 = (fVar137 + local_720._16_4_ + 4.0) * fStack_150;
                fStack_2cc = (fVar137 + local_720._20_4_ + 5.0) * fStack_14c;
                fStack_2c8 = (fVar137 + local_720._24_4_ + 6.0) * fStack_148;
                fStack_2c4 = fVar137 + local_720._28_4_ + 7.0;
                local_520._0_8_ = auVar19._0_8_;
                local_520._8_8_ = auVar19._8_8_;
                local_2c0 = local_520._0_8_;
                uStack_2b8 = local_520._8_8_;
                uStack_2b0 = 0;
                uStack_2a8 = 0;
                local_2a0 = local_740;
                uVar101 = vmovmskps_avx(auVar133);
                if (uVar101 == 0) {
                  bVar99 = 0;
LAB_0184053a:
                  auVar135 = ZEXT3264(local_720);
                  auVar199 = ZEXT3264(local_740);
                  auVar194 = ZEXT3264(CONCAT428(fVar207,CONCAT424(fVar207,CONCAT420(fVar207,
                                                  CONCAT416(fVar207,CONCAT412(fVar207,CONCAT48(
                                                  fVar207,CONCAT44(fVar207,fVar207))))))));
                  auVar188 = ZEXT3264(CONCAT428(fVar226,CONCAT424(fVar223,CONCAT420(fVar226,
                                                  CONCAT416(fVar223,CONCAT412(fVar226,CONCAT48(
                                                  fVar223,uVar109)))))));
                }
                else {
                  uVar103 = (ulong)(uVar101 & 0xff);
                  local_940 = ZEXT1632(CONCAT88(auVar159._8_8_,uVar103));
                  lVar25 = 0;
                  for (; (uVar103 & 1) == 0; uVar103 = uVar103 >> 1 | 0x8000000000000000) {
                    lVar25 = lVar25 + 1;
                  }
                  local_960 = ZEXT1632(CONCAT88(auVar10._8_8_,lVar25));
                  local_620 = *(undefined4 *)(ray + k * 4 + 0x100);
                  _local_5e0 = *pauVar5;
                  local_380 = local_740;
                  local_35c = iVar102;
                  local_350 = uVar189;
                  uStack_348 = uVar91;
                  local_340 = uVar92;
                  uStack_338 = uVar93;
                  local_330 = uVar94;
                  uStack_328 = uVar95;
                  do {
                    fVar137 = local_2e0[local_960._0_8_];
                    auVar112._4_4_ = fVar137;
                    auVar112._0_4_ = fVar137;
                    auVar112._8_4_ = fVar137;
                    auVar112._12_4_ = fVar137;
                    local_220._16_4_ = fVar137;
                    local_220._0_16_ = auVar112;
                    local_220._20_4_ = fVar137;
                    local_220._24_4_ = fVar137;
                    local_220._28_4_ = fVar137;
                    local_200 = *(undefined4 *)((long)&local_2c0 + local_960._0_8_ * 4);
                    *(undefined4 *)(ray + k * 4 + 0x100) =
                         *(undefined4 *)(local_2a0 + local_960._0_8_ * 4);
                    fVar173 = 1.0 - fVar137;
                    auVar159 = ZEXT416((uint)(fVar137 * fVar173 * 4.0));
                    auVar19 = vfnmsub213ss_fma(auVar112,auVar112,auVar159);
                    auVar159 = vfmadd213ss_fma(ZEXT416((uint)fVar173),ZEXT416((uint)fVar173),
                                               auVar159);
                    fVar136 = auVar159._0_4_ * 0.5;
                    fVar137 = fVar137 * fVar137 * 0.5;
                    auVar160._0_4_ = fVar137 * local_6f0;
                    auVar160._4_4_ = fVar137 * fStack_6ec;
                    auVar160._8_4_ = fVar137 * fStack_6e8;
                    auVar160._12_4_ = fVar137 * fStack_6e4;
                    auVar141._4_4_ = fVar136;
                    auVar141._0_4_ = fVar136;
                    auVar141._8_4_ = fVar136;
                    auVar141._12_4_ = fVar136;
                    auVar159 = vfmadd132ps_fma(auVar141,auVar160,auVar11);
                    fVar137 = auVar19._0_4_ * 0.5;
                    auVar161._4_4_ = fVar137;
                    auVar161._0_4_ = fVar137;
                    auVar161._8_4_ = fVar137;
                    auVar161._12_4_ = fVar137;
                    auVar159 = vfmadd132ps_fma(auVar161,auVar159,auVar12);
                    local_770.context = context->user;
                    fVar137 = fVar173 * -fVar173 * 0.5;
                    auVar142._4_4_ = fVar137;
                    auVar142._0_4_ = fVar137;
                    auVar142._8_4_ = fVar137;
                    auVar142._12_4_ = fVar137;
                    auVar19 = vfmadd132ps_fma(auVar142,auVar159,auVar13);
                    local_280 = auVar19._0_4_;
                    uStack_27c = local_280;
                    uStack_278 = local_280;
                    uStack_274 = local_280;
                    uStack_270 = local_280;
                    uStack_26c = local_280;
                    uStack_268 = local_280;
                    uStack_264 = local_280;
                    auVar159 = vmovshdup_avx(auVar19);
                    local_260 = auVar159._0_8_;
                    uStack_258 = local_260;
                    uStack_250 = local_260;
                    uStack_248 = local_260;
                    auVar159 = vshufps_avx(auVar19,auVar19,0xaa);
                    local_240._8_8_ = auVar159._0_8_;
                    local_240._0_8_ = local_240._8_8_;
                    local_240._16_8_ = local_240._8_8_;
                    local_240._24_8_ = local_240._8_8_;
                    uStack_1fc = local_200;
                    uStack_1f8 = local_200;
                    uStack_1f4 = local_200;
                    uStack_1f0 = local_200;
                    uStack_1ec = local_200;
                    uStack_1e8 = local_200;
                    uStack_1e4 = local_200;
                    local_1e0 = local_560;
                    uStack_1d8 = CONCAT44(uStack_554,uStack_558);
                    uStack_1d0 = CONCAT44(uStack_54c,uStack_550);
                    uStack_1c8 = CONCAT44(uStack_544,uStack_548);
                    local_1c0._4_4_ = uStack_13c;
                    local_1c0._0_4_ = local_140;
                    local_1c0._8_4_ = uStack_138;
                    local_1c0._12_4_ = uStack_134;
                    local_1c0._16_4_ = uStack_130;
                    local_1c0._20_4_ = uStack_12c;
                    local_1c0._24_4_ = uStack_128;
                    local_1c0._28_4_ = uStack_124;
                    vpcmpeqd_avx2(local_1c0,local_1c0);
                    local_1a0 = (local_770.context)->instID[0];
                    uStack_19c = local_1a0;
                    uStack_198 = local_1a0;
                    uStack_194 = local_1a0;
                    uStack_190 = local_1a0;
                    uStack_18c = local_1a0;
                    uStack_188 = local_1a0;
                    uStack_184 = local_1a0;
                    local_180 = (local_770.context)->instPrimID[0];
                    uStack_17c = local_180;
                    uStack_178 = local_180;
                    uStack_174 = local_180;
                    uStack_170 = local_180;
                    uStack_16c = local_180;
                    uStack_168 = local_180;
                    uStack_164 = local_180;
                    local_680 = local_420;
                    local_770.valid = (int *)local_680;
                    local_770.geometryUserPtr = pGVar17->userPtr;
                    local_770.hit = (RTCHitN *)&local_280;
                    local_770.N = 8;
                    local_770.ray = (RTCRayN *)ray;
                    if (pGVar17->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                      auVar213 = ZEXT1664(auVar213._0_16_);
                      (*pGVar17->occlusionFilterN)(&local_770);
                    }
                    auVar122 = vpcmpeqd_avx2(local_680,_DAT_01faff00);
                    auVar133 = _DAT_01fe9960 & ~auVar122;
                    if ((((((((auVar133 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                             (auVar133 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                            (auVar133 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                           SUB321(auVar133 >> 0x7f,0) == '\0') &&
                          (auVar133 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                         SUB321(auVar133 >> 0xbf,0) == '\0') &&
                        (auVar133 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                        -1 < auVar133[0x1f]) {
                      auVar122 = auVar122 ^ _DAT_01fe9960;
                    }
                    else {
                      p_Var18 = context->args->filter;
                      if ((p_Var18 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (((pGVar17->field_8).field_0x2 & 0x40) != 0)))) {
                        auVar213 = ZEXT1664(auVar213._0_16_);
                        (*p_Var18)(&local_770);
                      }
                      auVar133 = vpcmpeqd_avx2(local_680,_DAT_01faff00);
                      auVar122 = auVar133 ^ _DAT_01fe9960;
                      auVar151._8_4_ = 0xff800000;
                      auVar151._0_8_ = 0xff800000ff800000;
                      auVar151._12_4_ = 0xff800000;
                      auVar151._16_4_ = 0xff800000;
                      auVar151._20_4_ = 0xff800000;
                      auVar151._24_4_ = 0xff800000;
                      auVar151._28_4_ = 0xff800000;
                      auVar133 = vblendvps_avx(auVar151,*(undefined1 (*) [32])
                                                         (local_770.ray + 0x100),auVar133);
                      *(undefined1 (*) [32])(local_770.ray + 0x100) = auVar133;
                    }
                    if ((((((((auVar122 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                             (auVar122 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                            (auVar122 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                           SUB321(auVar122 >> 0x7f,0) != '\0') ||
                          (auVar122 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                         SUB321(auVar122 >> 0xbf,0) != '\0') ||
                        (auVar122 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                        auVar122[0x1f] < '\0') {
                      bVar99 = 1;
                      goto LAB_0184053a;
                    }
                    *(undefined4 *)(ray + k * 4 + 0x100) = local_620;
                    uVar104 = local_940._0_8_ ^ 1L << (local_960._0_8_ & 0x3f);
                    bVar99 = 0;
                    local_940._0_8_ = uVar104;
                    lVar25 = 0;
                    for (uVar103 = uVar104; (uVar103 & 1) == 0;
                        uVar103 = uVar103 >> 1 | 0x8000000000000000) {
                      lVar25 = lVar25 + 1;
                    }
                    local_960._0_8_ = lVar25;
                    auVar135 = ZEXT3264(local_720);
                    auVar199 = ZEXT3264(local_740);
                    auVar194 = ZEXT3264(CONCAT428(fVar207,CONCAT424(fVar207,CONCAT420(fVar207,
                                                  CONCAT416(fVar207,CONCAT412(fVar207,CONCAT48(
                                                  fVar207,CONCAT44(fVar207,fVar207))))))));
                    auVar188 = ZEXT3264(CONCAT428(fVar226,CONCAT424(fVar223,CONCAT420(fVar226,
                                                  CONCAT416(fVar223,CONCAT412(fVar226,CONCAT48(
                                                  fVar223,uVar109)))))));
                  } while (uVar104 != 0);
                }
              }
              auVar206 = ZEXT3264(auVar113);
              auVar203 = ZEXT3264(auVar152);
              bVar100 = (bool)(bVar100 | bVar99);
            }
          }
          local_720 = auVar135._0_32_;
          lVar106 = lVar106 + 8;
        } while ((int)lVar106 < iVar102);
      }
      if (bVar100) {
        return bVar100;
      }
      uVar108 = *(undefined4 *)(ray + k * 4 + 0x100);
      auVar123._4_4_ = uVar108;
      auVar123._0_4_ = uVar108;
      auVar123._8_4_ = uVar108;
      auVar123._12_4_ = uVar108;
      auVar123._16_4_ = uVar108;
      auVar123._20_4_ = uVar108;
      auVar123._24_4_ = uVar108;
      auVar123._28_4_ = uVar108;
      auVar113 = vcmpps_avx(local_80,auVar123,2);
      uVar101 = vmovmskps_avx(auVar113);
      uVar101 = (uint)uVar107 & uVar101;
    } while (uVar101 != 0);
  }
  return bVar100;
}

Assistant:

static __forceinline bool occluded_t(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID));

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }
          
          if (Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID)))
            return true;
          
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }